

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined8 uVar70;
  undefined8 uVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  ulong uVar75;
  ulong uVar76;
  bool bVar77;
  Geometry *geometry;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  long lVar78;
  uint uVar79;
  ulong uVar80;
  byte bVar81;
  float fVar82;
  float fVar83;
  float fVar129;
  float fVar130;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar84 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar87 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar88 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar132;
  float fVar135;
  float fVar136;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar137;
  undefined4 uVar138;
  float fVar142;
  float fVar143;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined8 uVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar168;
  undefined1 auVar167 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  uint uVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  LinearSpace3fa *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  
  PVar12 = prim[1];
  uVar76 = (ulong)(byte)PVar12;
  fVar149 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar24 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar84 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar146 = vsubps_avx(auVar24,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar148 = fVar149 * auVar146._0_4_;
  fVar137 = fVar149 * auVar84._0_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar24);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar86);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar93 = vpmovsxbd_avx2(auVar85);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar94 = vpmovsxbd_avx2(auVar193);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar8);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar106 = vcvtdq2ps_avx(auVar98);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar76 + 6);
  auVar96 = vpmovsxbd_avx2(auVar9);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar80 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar97 = vpmovsxbd_avx2(auVar10);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar80 + uVar76 + 6);
  auVar105 = vpmovsxbd_avx2(auVar192);
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar75 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar91 = vpmovsxbd_avx2(auVar11);
  auVar107 = vcvtdq2ps_avx(auVar91);
  auVar178._4_4_ = fVar137;
  auVar178._0_4_ = fVar137;
  auVar178._8_4_ = fVar137;
  auVar178._12_4_ = fVar137;
  auVar178._16_4_ = fVar137;
  auVar178._20_4_ = fVar137;
  auVar178._24_4_ = fVar137;
  auVar178._28_4_ = fVar137;
  auVar184._8_4_ = 1;
  auVar184._0_8_ = 0x100000001;
  auVar184._12_4_ = 1;
  auVar184._16_4_ = 1;
  auVar184._20_4_ = 1;
  auVar184._24_4_ = 1;
  auVar184._28_4_ = 1;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = ZEXT1632(CONCAT412(fVar149 * auVar84._12_4_,
                                CONCAT48(fVar149 * auVar84._8_4_,
                                         CONCAT44(fVar149 * auVar84._4_4_,fVar137))));
  auVar99 = vpermps_avx2(auVar184,auVar100);
  auVar90 = vpermps_avx512vl(auVar89,auVar100);
  fVar137 = auVar90._0_4_;
  fVar142 = auVar90._4_4_;
  auVar100._4_4_ = fVar142 * auVar93._4_4_;
  auVar100._0_4_ = fVar137 * auVar93._0_4_;
  fVar143 = auVar90._8_4_;
  auVar100._8_4_ = fVar143 * auVar93._8_4_;
  fVar166 = auVar90._12_4_;
  auVar100._12_4_ = fVar166 * auVar93._12_4_;
  fVar168 = auVar90._16_4_;
  auVar100._16_4_ = fVar168 * auVar93._16_4_;
  fVar82 = auVar90._20_4_;
  auVar100._20_4_ = fVar82 * auVar93._20_4_;
  fVar83 = auVar90._24_4_;
  auVar100._24_4_ = fVar83 * auVar93._24_4_;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar96._4_4_ * fVar142;
  auVar98._0_4_ = auVar96._0_4_ * fVar137;
  auVar98._8_4_ = auVar96._8_4_ * fVar143;
  auVar98._12_4_ = auVar96._12_4_ * fVar166;
  auVar98._16_4_ = auVar96._16_4_ * fVar168;
  auVar98._20_4_ = auVar96._20_4_ * fVar82;
  auVar98._24_4_ = auVar96._24_4_ * fVar83;
  auVar98._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar107._4_4_ * fVar142;
  auVar91._0_4_ = auVar107._0_4_ * fVar137;
  auVar91._8_4_ = auVar107._8_4_ * fVar143;
  auVar91._12_4_ = auVar107._12_4_ * fVar166;
  auVar91._16_4_ = auVar107._16_4_ * fVar168;
  auVar91._20_4_ = auVar107._20_4_ * fVar82;
  auVar91._24_4_ = auVar107._24_4_ * fVar83;
  auVar91._28_4_ = auVar90._28_4_;
  auVar24 = vfmadd231ps_fma(auVar100,auVar99,auVar92);
  auVar86 = vfmadd231ps_fma(auVar98,auVar99,auVar106);
  auVar85 = vfmadd231ps_fma(auVar91,auVar105,auVar99);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar178,auVar95);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar178,auVar94);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar97,auVar178);
  auVar179._4_4_ = fVar148;
  auVar179._0_4_ = fVar148;
  auVar179._8_4_ = fVar148;
  auVar179._12_4_ = fVar148;
  auVar179._16_4_ = fVar148;
  auVar179._20_4_ = fVar148;
  auVar179._24_4_ = fVar148;
  auVar179._28_4_ = fVar148;
  auVar91 = ZEXT1632(CONCAT412(fVar149 * auVar146._12_4_,
                               CONCAT48(fVar149 * auVar146._8_4_,
                                        CONCAT44(fVar149 * auVar146._4_4_,fVar148))));
  auVar98 = vpermps_avx2(auVar184,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  fVar149 = auVar91._0_4_;
  fVar137 = auVar91._4_4_;
  auVar99._4_4_ = fVar137 * auVar93._4_4_;
  auVar99._0_4_ = fVar149 * auVar93._0_4_;
  fVar142 = auVar91._8_4_;
  auVar99._8_4_ = fVar142 * auVar93._8_4_;
  fVar143 = auVar91._12_4_;
  auVar99._12_4_ = fVar143 * auVar93._12_4_;
  fVar166 = auVar91._16_4_;
  auVar99._16_4_ = fVar166 * auVar93._16_4_;
  fVar168 = auVar91._20_4_;
  auVar99._20_4_ = fVar168 * auVar93._20_4_;
  fVar82 = auVar91._24_4_;
  auVar99._24_4_ = fVar82 * auVar93._24_4_;
  auVar99._28_4_ = 1;
  auVar89._4_4_ = auVar96._4_4_ * fVar137;
  auVar89._0_4_ = auVar96._0_4_ * fVar149;
  auVar89._8_4_ = auVar96._8_4_ * fVar142;
  auVar89._12_4_ = auVar96._12_4_ * fVar143;
  auVar89._16_4_ = auVar96._16_4_ * fVar166;
  auVar89._20_4_ = auVar96._20_4_ * fVar168;
  auVar89._24_4_ = auVar96._24_4_ * fVar82;
  auVar89._28_4_ = auVar93._28_4_;
  auVar96._4_4_ = auVar107._4_4_ * fVar137;
  auVar96._0_4_ = auVar107._0_4_ * fVar149;
  auVar96._8_4_ = auVar107._8_4_ * fVar142;
  auVar96._12_4_ = auVar107._12_4_ * fVar143;
  auVar96._16_4_ = auVar107._16_4_ * fVar166;
  auVar96._20_4_ = auVar107._20_4_ * fVar168;
  auVar96._24_4_ = auVar107._24_4_ * fVar82;
  auVar96._28_4_ = auVar91._28_4_;
  auVar193 = vfmadd231ps_fma(auVar99,auVar98,auVar92);
  auVar8 = vfmadd231ps_fma(auVar89,auVar98,auVar106);
  auVar9 = vfmadd231ps_fma(auVar96,auVar98,auVar105);
  auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar179,auVar95);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar179,auVar94);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar179,auVar97);
  auVar95 = vandps_avx(ZEXT1632(auVar24),auVar170);
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar167._16_4_ = 0x219392ef;
  auVar167._20_4_ = 0x219392ef;
  auVar167._24_4_ = 0x219392ef;
  auVar167._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar95,auVar167,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar90._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar24._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar24._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar24._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar24._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar86),auVar170);
  uVar80 = vcmpps_avx512vl(auVar95,auVar167,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar101._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar86._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar86._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar86._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar86._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar85),auVar170);
  uVar80 = vcmpps_avx512vl(auVar95,auVar167,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar95._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar85._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar94 = vfnmadd213ps_avx512vl(auVar90,auVar92,auVar93);
  auVar24 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar101);
  auVar94 = vfnmadd213ps_avx512vl(auVar101,auVar92,auVar93);
  auVar86 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar95);
  auVar95 = vfnmadd213ps_avx512vl(auVar95,auVar92,auVar93);
  auVar85 = vfmadd132ps_fma(auVar95,auVar92,auVar92);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar193));
  auVar97._4_4_ = auVar24._4_4_ * auVar95._4_4_;
  auVar97._0_4_ = auVar24._0_4_ * auVar95._0_4_;
  auVar97._8_4_ = auVar24._8_4_ * auVar95._8_4_;
  auVar97._12_4_ = auVar24._12_4_ * auVar95._12_4_;
  auVar97._16_4_ = auVar95._16_4_ * 0.0;
  auVar97._20_4_ = auVar95._20_4_ * 0.0;
  auVar97._24_4_ = auVar95._24_4_ * 0.0;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar193));
  auVar96 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar104._0_4_ = auVar24._0_4_ * auVar95._0_4_;
  auVar104._4_4_ = auVar24._4_4_ * auVar95._4_4_;
  auVar104._8_4_ = auVar24._8_4_ * auVar95._8_4_;
  auVar104._12_4_ = auVar24._12_4_ * auVar95._12_4_;
  auVar104._16_4_ = auVar95._16_4_ * 0.0;
  auVar104._20_4_ = auVar95._20_4_ * 0.0;
  auVar104._24_4_ = auVar95._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar12 * 0x10 + uVar76 * -2 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar8));
  auVar105._4_4_ = auVar86._4_4_ * auVar95._4_4_;
  auVar105._0_4_ = auVar86._0_4_ * auVar95._0_4_;
  auVar105._8_4_ = auVar86._8_4_ * auVar95._8_4_;
  auVar105._12_4_ = auVar86._12_4_ * auVar95._12_4_;
  auVar105._16_4_ = auVar95._16_4_ * 0.0;
  auVar105._20_4_ = auVar95._20_4_ * 0.0;
  auVar105._24_4_ = auVar95._24_4_ * 0.0;
  auVar105._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar92);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar8));
  auVar103._0_4_ = auVar86._0_4_ * auVar95._0_4_;
  auVar103._4_4_ = auVar86._4_4_ * auVar95._4_4_;
  auVar103._8_4_ = auVar86._8_4_ * auVar95._8_4_;
  auVar103._12_4_ = auVar86._12_4_ * auVar95._12_4_;
  auVar103._16_4_ = auVar95._16_4_ * 0.0;
  auVar103._20_4_ = auVar95._20_4_ * 0.0;
  auVar103._24_4_ = auVar95._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 + uVar76 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar9));
  auVar107._4_4_ = auVar95._4_4_ * auVar85._4_4_;
  auVar107._0_4_ = auVar95._0_4_ * auVar85._0_4_;
  auVar107._8_4_ = auVar95._8_4_ * auVar85._8_4_;
  auVar107._12_4_ = auVar95._12_4_ * auVar85._12_4_;
  auVar107._16_4_ = auVar95._16_4_ * 0.0;
  auVar107._20_4_ = auVar95._20_4_ * 0.0;
  auVar107._24_4_ = auVar95._24_4_ * 0.0;
  auVar107._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar9));
  auVar102._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar102._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar102._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar102._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar102._16_4_ = auVar95._16_4_ * 0.0;
  auVar102._20_4_ = auVar95._20_4_ * 0.0;
  auVar102._24_4_ = auVar95._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar97,auVar104);
  auVar92 = vpminsd_avx2(auVar105,auVar103);
  auVar95 = vmaxps_avx(auVar95,auVar92);
  auVar92 = vpminsd_avx2(auVar107,auVar102);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar93._4_4_ = uVar138;
  auVar93._0_4_ = uVar138;
  auVar93._8_4_ = uVar138;
  auVar93._12_4_ = uVar138;
  auVar93._16_4_ = uVar138;
  auVar93._20_4_ = uVar138;
  auVar93._24_4_ = uVar138;
  auVar93._28_4_ = uVar138;
  auVar92 = vmaxps_avx512vl(auVar92,auVar93);
  auVar95 = vmaxps_avx(auVar95,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar95,auVar92);
  auVar95 = vpmaxsd_avx2(auVar97,auVar104);
  auVar92 = vpmaxsd_avx2(auVar105,auVar103);
  auVar95 = vminps_avx(auVar95,auVar92);
  auVar92 = vpmaxsd_avx2(auVar107,auVar102);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar138;
  auVar94._0_4_ = uVar138;
  auVar94._8_4_ = uVar138;
  auVar94._12_4_ = uVar138;
  auVar94._16_4_ = uVar138;
  auVar94._20_4_ = uVar138;
  auVar94._24_4_ = uVar138;
  auVar94._28_4_ = uVar138;
  auVar92 = vminps_avx512vl(auVar92,auVar94);
  auVar95 = vminps_avx(auVar95,auVar92);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar106);
  uVar27 = vpcmpgtd_avx512vl(auVar96,_DAT_01fe9900);
  uVar25 = vcmpps_avx512vl(local_80,auVar95,2);
  if ((byte)((byte)uVar25 & (byte)uVar27) == 0) {
    bVar77 = false;
  }
  else {
    uVar80 = (ulong)(byte)((byte)uVar25 & (byte)uVar27);
    local_588 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar95 = local_460;
      lVar28 = 0;
      for (uVar75 = uVar80; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar79 = *(uint *)(prim + 2);
      pGVar14 = (context->scene->geometries).items[uVar79].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(prim + lVar28 * 4 + 6));
      uVar75 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar28 * 4 + 6)));
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar28 = *(long *)&pGVar14[1].time_range.upper;
      auVar24 = *(undefined1 (*) [16])(lVar28 + (long)p_Var15 * uVar75);
      pauVar3 = (undefined1 (*) [16])(lVar28 + (uVar75 + 1) * (long)p_Var15);
      uVar25 = *(undefined8 *)*pauVar3;
      uVar27 = *(undefined8 *)(*pauVar3 + 8);
      auVar10 = *pauVar3;
      auVar8 = *pauVar3;
      auVar86 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar28 + (uVar75 + 2) * (long)p_Var15);
      uVar70 = *(undefined8 *)*pauVar4;
      uVar71 = *(undefined8 *)(*pauVar4 + 8);
      auVar9 = *pauVar4;
      auVar193 = *pauVar4;
      auVar85 = *pauVar4;
      uVar80 = uVar80 - 1 & uVar80;
      pauVar5 = (undefined1 (*) [12])(lVar28 + (uVar75 + 3) * (long)p_Var15);
      local_5a0 = (float)*(undefined8 *)*pauVar5;
      fStack_59c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_598 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_594 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar80 != 0) {
        uVar76 = uVar80 - 1 & uVar80;
        for (uVar75 = uVar80; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        }
        if (uVar76 != 0) {
          for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar192 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar192 = vinsertps_avx(auVar192,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar84 = vsubps_avx(auVar24,auVar192);
      uVar138 = auVar84._0_4_;
      auVar146._4_4_ = uVar138;
      auVar146._0_4_ = uVar138;
      auVar146._8_4_ = uVar138;
      auVar146._12_4_ = uVar138;
      auVar11 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      aVar6 = (local_588->vx).field_0;
      aVar7 = (local_588->vy).field_0;
      fVar149 = (local_588->vz).field_0.m128[0];
      fVar137 = *(float *)((long)&(local_588->vz).field_0 + 4);
      fVar142 = *(float *)((long)&(local_588->vz).field_0 + 8);
      fVar143 = *(float *)((long)&(local_588->vz).field_0 + 0xc);
      auVar173._0_4_ = fVar149 * auVar84._0_4_;
      auVar173._4_4_ = fVar137 * auVar84._4_4_;
      auVar173._8_4_ = fVar142 * auVar84._8_4_;
      auVar173._12_4_ = fVar143 * auVar84._12_4_;
      auVar11 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar11);
      auVar173 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar6,auVar146);
      auVar11 = vshufps_avx(auVar24,auVar24,0xff);
      auVar146 = vsubps_avx(auVar86,auVar192);
      uVar138 = auVar146._0_4_;
      auVar150._4_4_ = uVar138;
      auVar150._0_4_ = uVar138;
      auVar150._8_4_ = uVar138;
      auVar150._12_4_ = uVar138;
      auVar84 = vshufps_avx(auVar146,auVar146,0x55);
      auVar146 = vshufps_avx(auVar146,auVar146,0xaa);
      auVar174._0_4_ = fVar149 * auVar146._0_4_;
      auVar174._4_4_ = fVar137 * auVar146._4_4_;
      auVar174._8_4_ = fVar142 * auVar146._8_4_;
      auVar174._12_4_ = fVar143 * auVar146._12_4_;
      auVar84 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar84);
      auVar150 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar150);
      auVar86 = vshufps_avx(auVar86,auVar86,0xff);
      auVar146 = vsubps_avx(auVar85,auVar192);
      uVar138 = auVar146._0_4_;
      auVar169._4_4_ = uVar138;
      auVar169._0_4_ = uVar138;
      auVar169._8_4_ = uVar138;
      auVar169._12_4_ = uVar138;
      auVar84 = vshufps_avx(auVar146,auVar146,0x55);
      auVar146 = vshufps_avx(auVar146,auVar146,0xaa);
      auVar88._0_4_ = fVar149 * auVar146._0_4_;
      auVar88._4_4_ = fVar137 * auVar146._4_4_;
      auVar88._8_4_ = fVar142 * auVar146._8_4_;
      auVar88._12_4_ = fVar143 * auVar146._12_4_;
      auVar84 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar7,auVar84);
      auVar146 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar169);
      auVar85 = vshufps_avx(auVar85,auVar85,0xff);
      auVar30._12_4_ = fStack_594;
      auVar30._0_12_ = *pauVar5;
      auVar84 = vsubps_avx512vl(auVar30,auVar192);
      uVar138 = auVar84._0_4_;
      auVar87._4_4_ = uVar138;
      auVar87._0_4_ = uVar138;
      auVar87._8_4_ = uVar138;
      auVar87._12_4_ = uVar138;
      auVar192 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar176._0_4_ = fVar149 * auVar84._0_4_;
      auVar176._4_4_ = fVar137 * auVar84._4_4_;
      auVar176._8_4_ = fVar142 * auVar84._8_4_;
      auVar176._12_4_ = fVar143 * auVar84._12_4_;
      auVar192 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar192);
      auVar192 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar6,auVar87);
      lVar28 = (long)iVar13 * 0x44;
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      auVar84 = vshufps_avx512vl(auVar30,auVar30,0xff);
      local_4e0 = vbroadcastss_avx512vl(auVar173);
      auVar155._8_4_ = 1;
      auVar155._0_8_ = 0x100000001;
      auVar155._12_4_ = 1;
      auVar155._16_4_ = 1;
      auVar155._20_4_ = 1;
      auVar155._24_4_ = 1;
      auVar155._28_4_ = 1;
      local_500 = vpermps_avx512vl(auVar155,ZEXT1632(auVar173));
      uVar144 = auVar11._0_8_;
      local_a0._8_8_ = uVar144;
      local_a0._0_8_ = uVar144;
      local_a0._16_8_ = uVar144;
      local_a0._24_8_ = uVar144;
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      local_540 = vbroadcastss_avx512vl(auVar150);
      local_560 = vpermps_avx2(auVar155,ZEXT1632(auVar150));
      uVar144 = auVar86._0_8_;
      local_c0._8_8_ = uVar144;
      local_c0._0_8_ = uVar144;
      local_c0._16_8_ = uVar144;
      local_c0._24_8_ = uVar144;
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      uVar138 = auVar146._0_4_;
      local_660._4_4_ = uVar138;
      local_660._0_4_ = uVar138;
      local_660._8_4_ = uVar138;
      local_660._12_4_ = uVar138;
      local_660._16_4_ = uVar138;
      local_660._20_4_ = uVar138;
      local_660._24_4_ = uVar138;
      local_660._28_4_ = uVar138;
      local_640 = vpermps_avx512vl(auVar155,ZEXT1632(auVar146));
      auVar195 = ZEXT3264(local_640);
      local_e0 = vbroadcastsd_avx512vl(auVar85);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar192);
      auVar198 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar155,ZEXT1632(auVar192));
      auVar197 = ZEXT3264(local_620);
      _local_100 = vbroadcastsd_avx512vl(auVar84);
      auVar96 = vmulps_avx512vl(local_600,auVar106);
      auVar97 = vmulps_avx512vl(local_620,auVar106);
      auVar86 = vfmadd231ps_fma(auVar96,auVar94,local_660);
      auVar96 = vfmadd231ps_avx512vl(auVar97,auVar94,local_640);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar93,local_540);
      auVar86 = vfmadd231ps_fma(auVar96,auVar93,local_560);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar92,local_4e0);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,local_500);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar99 = vmulps_avx512vl(local_600,auVar107);
      auVar100 = vmulps_avx512vl(local_620,auVar107);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_660);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_640);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_540);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_560);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_4e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_500);
      auVar89 = vsubps_avx512vl(auVar99,auVar98);
      auVar90 = vsubps_avx512vl(auVar100,auVar91);
      auVar101 = vmulps_avx512vl(auVar91,auVar89);
      auVar102 = vmulps_avx512vl(auVar98,auVar90);
      auVar101 = vsubps_avx512vl(auVar101,auVar102);
      auVar102 = vmulps_avx512vl(_local_100,auVar106);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_e0);
      auVar86 = vfmadd231ps_fma(auVar102,auVar93,local_c0);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,local_a0);
      auVar103 = vmulps_avx512vl(_local_100,auVar107);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,local_c0);
      auVar11 = vfmadd231ps_fma(auVar103,auVar96,local_a0);
      auVar103 = vmulps_avx512vl(auVar90,auVar90);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar89,auVar89);
      auVar104 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar11));
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      auVar103 = vmulps_avx512vl(auVar104,auVar103);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar144 = vcmpps_avx512vl(auVar101,auVar103,2);
      auVar86 = vblendps_avx(auVar173,auVar24,8);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar85 = vandps_avx512vl(auVar86,auVar84);
      auVar86 = vblendps_avx(auVar150,*pauVar3,8);
      auVar86 = vandps_avx512vl(auVar86,auVar84);
      auVar85 = vmaxps_avx(auVar85,auVar86);
      auVar86 = vblendps_avx(auVar146,*pauVar4,8);
      auVar87 = vandps_avx512vl(auVar86,auVar84);
      auVar86 = vblendps_avx(auVar192,auVar30,8);
      auVar86 = vandps_avx512vl(auVar86,auVar84);
      auVar86 = vmaxps_avx(auVar87,auVar86);
      auVar86 = vmaxps_avx(auVar85,auVar86);
      auVar85 = vmovshdup_avx(auVar86);
      auVar85 = vmaxss_avx(auVar85,auVar86);
      auVar86 = vshufpd_avx(auVar86,auVar86,1);
      auVar86 = vmaxss_avx(auVar86,auVar85);
      auVar177._0_4_ = (float)iVar13;
      local_460._4_12_ = auVar173._4_12_;
      local_460._0_4_ = auVar177._0_4_;
      local_460._16_16_ = auVar95._16_16_;
      auVar177._4_4_ = auVar177._0_4_;
      auVar177._8_4_ = auVar177._0_4_;
      auVar177._12_4_ = auVar177._0_4_;
      auVar177._16_4_ = auVar177._0_4_;
      auVar177._20_4_ = auVar177._0_4_;
      auVar177._24_4_ = auVar177._0_4_;
      auVar177._28_4_ = auVar177._0_4_;
      uVar26 = vcmpps_avx512vl(auVar177,_DAT_01faff40,0xe);
      bVar81 = (byte)uVar144 & (byte)uVar26;
      local_400 = auVar86._0_4_ * 4.7683716e-07;
      auVar153._8_4_ = 2;
      auVar153._0_8_ = 0x200000002;
      auVar153._12_4_ = 2;
      auVar153._16_4_ = 2;
      auVar153._20_4_ = 2;
      auVar153._24_4_ = 2;
      auVar153._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar153,ZEXT1632(auVar173));
      local_140 = vpermps_avx512vl(auVar153,ZEXT1632(auVar150));
      local_160 = vpermps_avx512vl(auVar153,ZEXT1632(auVar146));
      local_5e0 = vpermps_avx2(auVar153,ZEXT1632(auVar192));
      uVar172 = *(uint *)(ray + k * 4 + 0x60);
      fStack_3fc = 0.0;
      fStack_3f8 = 0.0;
      fStack_3f4 = 0.0;
      auVar86 = auVar90._0_16_;
      if (bVar81 == 0) {
        bVar77 = false;
        auVar86 = vxorps_avx512vl(auVar86,auVar86);
        auVar194 = ZEXT1664(auVar86);
        auVar189 = ZEXT3264(local_4e0);
        auVar190 = ZEXT3264(local_500);
        auVar191 = ZEXT3264(local_540);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar196 = ZEXT3264(auVar95);
        auVar188 = ZEXT3264(local_560);
        auVar187 = ZEXT3264(local_660);
      }
      else {
        local_580._0_16_ = ZEXT416(uVar172);
        auVar95 = vmulps_avx512vl(local_5e0,auVar107);
        auVar95 = vfmadd213ps_avx512vl(auVar105,local_160,auVar95);
        auVar95 = vfmadd213ps_avx512vl(auVar97,local_140,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar95);
        auVar95 = vmulps_avx512vl(local_5e0,auVar106);
        auVar95 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
        auVar97 = vfmadd213ps_avx512vl(auVar93,local_140,auVar95);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar97 = vfmadd213ps_avx512vl(auVar92,local_120,auVar97);
        auVar92 = vmulps_avx512vl(local_600,auVar106);
        auVar105 = vmulps_avx512vl(local_620,auVar106);
        auVar106 = vmulps_avx512vl(local_5e0,auVar106);
        auVar85 = vfmadd231ps_fma(auVar92,auVar94,local_660);
        auVar92 = vfmadd231ps_avx512vl(auVar105,auVar94,local_640);
        auVar94 = vfmadd231ps_avx512vl(auVar106,local_160,auVar94);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar93,local_540);
        auVar188 = ZEXT3264(local_560);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,local_560);
        auVar105 = vfmadd231ps_avx512vl(auVar94,local_140,auVar93);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar95,local_4e0);
        auVar107 = vfmadd231ps_avx512vl(auVar92,auVar95,local_500);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_120,auVar95);
        auVar95 = vmulps_avx512vl(local_600,auVar94);
        auVar101 = vmulps_avx512vl(local_620,auVar94);
        auVar94 = vmulps_avx512vl(local_5e0,auVar94);
        auVar85 = vfmadd231ps_fma(auVar95,auVar93,local_660);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar93,local_640);
        auVar93 = vfmadd231ps_avx512vl(auVar94,local_160,auVar93);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar95,local_540);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,local_560);
        auVar95 = vfmadd231ps_avx512vl(auVar93,local_140,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar94,auVar92,local_4e0);
        auVar94 = vfmadd231ps_avx512vl(auVar101,auVar92,local_500);
        auVar101 = vfmadd231ps_avx512vl(auVar95,local_120,auVar92);
        auVar185._8_4_ = 0x7fffffff;
        auVar185._0_8_ = 0x7fffffff7fffffff;
        auVar185._12_4_ = 0x7fffffff;
        auVar185._16_4_ = 0x7fffffff;
        auVar185._20_4_ = 0x7fffffff;
        auVar185._24_4_ = 0x7fffffff;
        auVar185._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(auVar106,auVar185);
        auVar92 = vandps_avx(auVar107,auVar185);
        auVar92 = vmaxps_avx(auVar95,auVar92);
        auVar95 = vandps_avx(auVar105,auVar185);
        auVar95 = vmaxps_avx(auVar92,auVar95);
        auVar105 = vbroadcastss_avx512vl(ZEXT416((uint)local_400));
        uVar75 = vcmpps_avx512vl(auVar95,auVar105,1);
        bVar77 = (bool)((byte)uVar75 & 1);
        auVar108._0_4_ = (float)((uint)bVar77 * auVar89._0_4_ | (uint)!bVar77 * auVar106._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar77 * auVar89._4_4_ | (uint)!bVar77 * auVar106._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar77 * auVar89._8_4_ | (uint)!bVar77 * auVar106._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar77 * auVar89._12_4_ | (uint)!bVar77 * auVar106._12_4_);
        bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar77 * auVar89._16_4_ | (uint)!bVar77 * auVar106._16_4_);
        bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar77 * auVar89._20_4_ | (uint)!bVar77 * auVar106._20_4_);
        bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar77 * auVar89._24_4_ | (uint)!bVar77 * auVar106._24_4_);
        bVar77 = SUB81(uVar75 >> 7,0);
        auVar108._28_4_ = (uint)bVar77 * auVar89._28_4_ | (uint)!bVar77 * auVar106._28_4_;
        bVar77 = (bool)((byte)uVar75 & 1);
        auVar109._0_4_ = (float)((uint)bVar77 * auVar90._0_4_ | (uint)!bVar77 * auVar107._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar77 * auVar90._4_4_ | (uint)!bVar77 * auVar107._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar77 * auVar90._8_4_ | (uint)!bVar77 * auVar107._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar77 * auVar90._12_4_ | (uint)!bVar77 * auVar107._12_4_);
        bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar77 * auVar90._16_4_ | (uint)!bVar77 * auVar107._16_4_);
        bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar77 * auVar90._20_4_ | (uint)!bVar77 * auVar107._20_4_);
        bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar77 * auVar90._24_4_ | (uint)!bVar77 * auVar107._24_4_);
        bVar77 = SUB81(uVar75 >> 7,0);
        auVar109._28_4_ = (uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar107._28_4_;
        auVar95 = vandps_avx(auVar185,auVar93);
        auVar92 = vandps_avx(auVar94,auVar185);
        auVar92 = vmaxps_avx(auVar95,auVar92);
        auVar95 = vandps_avx(auVar101,auVar185);
        auVar95 = vmaxps_avx(auVar92,auVar95);
        uVar75 = vcmpps_avx512vl(auVar95,auVar105,1);
        bVar77 = (bool)((byte)uVar75 & 1);
        auVar110._0_4_ = (float)((uint)bVar77 * auVar89._0_4_ | (uint)!bVar77 * auVar93._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar77 * auVar89._4_4_ | (uint)!bVar77 * auVar93._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar77 * auVar89._8_4_ | (uint)!bVar77 * auVar93._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar77 * auVar89._12_4_ | (uint)!bVar77 * auVar93._12_4_);
        bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar77 * auVar89._16_4_ | (uint)!bVar77 * auVar93._16_4_);
        bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar77 * auVar89._20_4_ | (uint)!bVar77 * auVar93._20_4_);
        bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar77 * auVar89._24_4_ | (uint)!bVar77 * auVar93._24_4_);
        bVar77 = SUB81(uVar75 >> 7,0);
        auVar110._28_4_ = (uint)bVar77 * auVar89._28_4_ | (uint)!bVar77 * auVar93._28_4_;
        bVar77 = (bool)((byte)uVar75 & 1);
        auVar111._0_4_ = (float)((uint)bVar77 * auVar90._0_4_ | (uint)!bVar77 * auVar94._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar77 * auVar90._4_4_ | (uint)!bVar77 * auVar94._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar77 * auVar90._8_4_ | (uint)!bVar77 * auVar94._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar77 * auVar90._12_4_ | (uint)!bVar77 * auVar94._12_4_);
        bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar77 * auVar90._16_4_ | (uint)!bVar77 * auVar94._16_4_);
        bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar77 * auVar90._20_4_ | (uint)!bVar77 * auVar94._20_4_);
        bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar77 * auVar90._24_4_ | (uint)!bVar77 * auVar94._24_4_);
        bVar77 = SUB81(uVar75 >> 7,0);
        auVar111._28_4_ = (uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar94._28_4_;
        auVar88 = vxorps_avx512vl(auVar86,auVar86);
        auVar194 = ZEXT1664(auVar88);
        auVar95 = vfmadd213ps_avx512vl(auVar108,auVar108,ZEXT1632(auVar88));
        auVar86 = vfmadd231ps_fma(auVar95,auVar109,auVar109);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar149 = auVar95._0_4_;
        fVar137 = auVar95._4_4_;
        fVar142 = auVar95._8_4_;
        fVar143 = auVar95._12_4_;
        fVar166 = auVar95._16_4_;
        fVar168 = auVar95._20_4_;
        fVar82 = auVar95._24_4_;
        auVar36._4_4_ = fVar137 * fVar137 * fVar137 * auVar86._4_4_ * -0.5;
        auVar36._0_4_ = fVar149 * fVar149 * fVar149 * auVar86._0_4_ * -0.5;
        auVar36._8_4_ = fVar142 * fVar142 * fVar142 * auVar86._8_4_ * -0.5;
        auVar36._12_4_ = fVar143 * fVar143 * fVar143 * auVar86._12_4_ * -0.5;
        auVar36._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar36._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar36._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
        auVar36._28_4_ = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar36,auVar92,auVar95);
        auVar37._4_4_ = auVar109._4_4_ * auVar93._4_4_;
        auVar37._0_4_ = auVar109._0_4_ * auVar93._0_4_;
        auVar37._8_4_ = auVar109._8_4_ * auVar93._8_4_;
        auVar37._12_4_ = auVar109._12_4_ * auVar93._12_4_;
        auVar37._16_4_ = auVar109._16_4_ * auVar93._16_4_;
        auVar37._20_4_ = auVar109._20_4_ * auVar93._20_4_;
        auVar37._24_4_ = auVar109._24_4_ * auVar93._24_4_;
        auVar37._28_4_ = auVar95._28_4_;
        auVar38._4_4_ = auVar93._4_4_ * -auVar108._4_4_;
        auVar38._0_4_ = auVar93._0_4_ * -auVar108._0_4_;
        auVar38._8_4_ = auVar93._8_4_ * -auVar108._8_4_;
        auVar38._12_4_ = auVar93._12_4_ * -auVar108._12_4_;
        auVar38._16_4_ = auVar93._16_4_ * -auVar108._16_4_;
        auVar38._20_4_ = auVar93._20_4_ * -auVar108._20_4_;
        auVar38._24_4_ = auVar93._24_4_ * -auVar108._24_4_;
        auVar38._28_4_ = auVar108._28_4_ ^ 0x80000000;
        auVar95 = vmulps_avx512vl(auVar93,ZEXT1632(auVar88));
        auVar107 = ZEXT1632(auVar88);
        auVar94 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar107);
        auVar86 = vfmadd231ps_fma(auVar94,auVar111,auVar111);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
        fVar149 = auVar94._0_4_;
        fVar137 = auVar94._4_4_;
        fVar142 = auVar94._8_4_;
        fVar143 = auVar94._12_4_;
        fVar166 = auVar94._16_4_;
        fVar168 = auVar94._20_4_;
        fVar82 = auVar94._24_4_;
        auVar39._4_4_ = fVar137 * fVar137 * fVar137 * auVar86._4_4_ * -0.5;
        auVar39._0_4_ = fVar149 * fVar149 * fVar149 * auVar86._0_4_ * -0.5;
        auVar39._8_4_ = fVar142 * fVar142 * fVar142 * auVar86._8_4_ * -0.5;
        auVar39._12_4_ = fVar143 * fVar143 * fVar143 * auVar86._12_4_ * -0.5;
        auVar39._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar39._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar39._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
        auVar39._28_4_ = 0;
        auVar92 = vfmadd231ps_avx512vl(auVar39,auVar92,auVar94);
        auVar40._4_4_ = auVar111._4_4_ * auVar92._4_4_;
        auVar40._0_4_ = auVar111._0_4_ * auVar92._0_4_;
        auVar40._8_4_ = auVar111._8_4_ * auVar92._8_4_;
        auVar40._12_4_ = auVar111._12_4_ * auVar92._12_4_;
        auVar40._16_4_ = auVar111._16_4_ * auVar92._16_4_;
        auVar40._20_4_ = auVar111._20_4_ * auVar92._20_4_;
        auVar40._24_4_ = auVar111._24_4_ * auVar92._24_4_;
        auVar40._28_4_ = auVar94._28_4_;
        auVar41._4_4_ = -auVar110._4_4_ * auVar92._4_4_;
        auVar41._0_4_ = -auVar110._0_4_ * auVar92._0_4_;
        auVar41._8_4_ = -auVar110._8_4_ * auVar92._8_4_;
        auVar41._12_4_ = -auVar110._12_4_ * auVar92._12_4_;
        auVar41._16_4_ = -auVar110._16_4_ * auVar92._16_4_;
        auVar41._20_4_ = -auVar110._20_4_ * auVar92._20_4_;
        auVar41._24_4_ = -auVar110._24_4_ * auVar92._24_4_;
        auVar41._28_4_ = auVar93._28_4_;
        auVar92 = vmulps_avx512vl(auVar92,auVar107);
        auVar86 = vfmadd213ps_fma(auVar37,auVar102,auVar98);
        auVar85 = vfmadd213ps_fma(auVar38,auVar102,auVar91);
        auVar93 = vfmadd213ps_avx512vl(auVar95,auVar102,auVar97);
        auVar94 = vfmadd213ps_avx512vl(auVar40,ZEXT1632(auVar11),auVar99);
        auVar150 = vfnmadd213ps_fma(auVar37,auVar102,auVar98);
        auVar105 = ZEXT1632(auVar11);
        auVar192 = vfmadd213ps_fma(auVar41,auVar105,auVar100);
        auVar30 = vfnmadd213ps_fma(auVar38,auVar102,auVar91);
        auVar84 = vfmadd213ps_fma(auVar92,auVar105,auVar96);
        auVar106 = vfnmadd231ps_avx512vl(auVar97,auVar102,auVar95);
        auVar87 = vfnmadd213ps_fma(auVar40,auVar105,auVar99);
        auVar169 = vfnmadd213ps_fma(auVar41,auVar105,auVar100);
        auVar174 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar11),auVar92);
        auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar150));
        auVar95 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar30));
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar84),auVar106);
        auVar97 = vmulps_avx512vl(auVar95,auVar106);
        auVar146 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar30),auVar96);
        auVar42._4_4_ = auVar150._4_4_ * auVar96._4_4_;
        auVar42._0_4_ = auVar150._0_4_ * auVar96._0_4_;
        auVar42._8_4_ = auVar150._8_4_ * auVar96._8_4_;
        auVar42._12_4_ = auVar150._12_4_ * auVar96._12_4_;
        auVar42._16_4_ = auVar96._16_4_ * 0.0;
        auVar42._20_4_ = auVar96._20_4_ * 0.0;
        auVar42._24_4_ = auVar96._24_4_ * 0.0;
        auVar42._28_4_ = auVar96._28_4_;
        auVar96 = vfmsub231ps_avx512vl(auVar42,auVar106,auVar92);
        auVar43._4_4_ = auVar30._4_4_ * auVar92._4_4_;
        auVar43._0_4_ = auVar30._0_4_ * auVar92._0_4_;
        auVar43._8_4_ = auVar30._8_4_ * auVar92._8_4_;
        auVar43._12_4_ = auVar30._12_4_ * auVar92._12_4_;
        auVar43._16_4_ = auVar92._16_4_ * 0.0;
        auVar43._20_4_ = auVar92._20_4_ * 0.0;
        auVar43._24_4_ = auVar92._24_4_ * 0.0;
        auVar43._28_4_ = auVar92._28_4_;
        auVar173 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar150),auVar95);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar173),auVar107,auVar96);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,ZEXT1632(auVar146));
        auVar99 = ZEXT1632(auVar88);
        uVar75 = vcmpps_avx512vl(auVar95,auVar99,2);
        bVar74 = (byte)uVar75;
        fVar82 = (float)((uint)(bVar74 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar87._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        fVar148 = (float)((uint)bVar77 * auVar86._4_4_ | (uint)!bVar77 * auVar87._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        fVar130 = (float)((uint)bVar77 * auVar86._8_4_ | (uint)!bVar77 * auVar87._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        fVar133 = (float)((uint)bVar77 * auVar86._12_4_ | (uint)!bVar77 * auVar87._12_4_);
        auVar97 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar130,CONCAT44(fVar148,fVar82))));
        fVar83 = (float)((uint)(bVar74 & 1) * auVar85._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar169._0_4_);
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        fVar129 = (float)((uint)bVar77 * auVar85._4_4_ | (uint)!bVar77 * auVar169._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        fVar131 = (float)((uint)bVar77 * auVar85._8_4_ | (uint)!bVar77 * auVar169._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        fVar134 = (float)((uint)bVar77 * auVar85._12_4_ | (uint)!bVar77 * auVar169._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar129,fVar83))));
        auVar112._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar174._0_4_
                    );
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar77 * auVar93._4_4_ | (uint)!bVar77 * auVar174._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar77 * auVar93._8_4_ | (uint)!bVar77 * auVar174._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar77 * auVar93._12_4_ | (uint)!bVar77 * auVar174._12_4_);
        fVar149 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar93._16_4_);
        auVar112._16_4_ = fVar149;
        fVar137 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar93._20_4_);
        auVar112._20_4_ = fVar137;
        fVar142 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar93._24_4_);
        auVar112._24_4_ = fVar142;
        iVar1 = (uint)(byte)(uVar75 >> 7) * auVar93._28_4_;
        auVar112._28_4_ = iVar1;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar150),auVar94);
        auVar113._0_4_ =
             (uint)(bVar74 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar146._0_4_;
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar146._4_4_;
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar146._8_4_;
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar146._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar92._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar92._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar92._24_4_;
        auVar113._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar192));
        auVar114._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar85._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar85._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar85._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar85._12_4_);
        fVar143 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar92._16_4_);
        auVar114._16_4_ = fVar143;
        fVar166 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar92._20_4_);
        auVar114._20_4_ = fVar166;
        fVar168 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar92._24_4_);
        auVar114._24_4_ = fVar168;
        auVar114._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar92._28_4_;
        auVar92 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar84));
        auVar115._0_4_ =
             (float)((uint)(bVar74 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar93._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar93._4_4_);
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar93._8_4_);
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar93._12_4_);
        bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar77 * auVar92._16_4_ | (uint)!bVar77 * auVar93._16_4_);
        bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar77 * auVar92._20_4_ | (uint)!bVar77 * auVar93._20_4_);
        bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar77 * auVar92._24_4_ | (uint)!bVar77 * auVar93._24_4_);
        bVar77 = SUB81(uVar75 >> 7,0);
        auVar115._28_4_ = (uint)bVar77 * auVar92._28_4_ | (uint)!bVar77 * auVar93._28_4_;
        auVar116._0_4_ =
             (uint)(bVar74 & 1) * (int)auVar150._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar94._0_4_;
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar77 * (int)auVar150._4_4_ | (uint)!bVar77 * auVar94._4_4_;
        bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar77 * (int)auVar150._8_4_ | (uint)!bVar77 * auVar94._8_4_;
        bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar77 * (int)auVar150._12_4_ | (uint)!bVar77 * auVar94._12_4_;
        auVar116._16_4_ = (uint)!(bool)((byte)(uVar75 >> 4) & 1) * auVar94._16_4_;
        auVar116._20_4_ = (uint)!(bool)((byte)(uVar75 >> 5) & 1) * auVar94._20_4_;
        auVar116._24_4_ = (uint)!(bool)((byte)(uVar75 >> 6) & 1) * auVar94._24_4_;
        auVar116._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar94._28_4_;
        bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar117._0_4_ =
             (uint)(bVar74 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar84._0_4_;
        bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar16 * auVar106._4_4_ | (uint)!bVar16 * auVar84._4_4_;
        bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar16 * auVar106._8_4_ | (uint)!bVar16 * auVar84._8_4_;
        bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar16 * auVar106._12_4_ | (uint)!bVar16 * auVar84._12_4_;
        auVar117._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar106._16_4_;
        auVar117._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar106._20_4_;
        auVar117._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar106._24_4_;
        iVar2 = (uint)(byte)(uVar75 >> 7) * auVar106._28_4_;
        auVar117._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar116,auVar97);
        auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar30._12_4_ |
                                                (uint)!bVar18 * auVar192._12_4_,
                                                CONCAT48((uint)bVar17 * (int)auVar30._8_4_ |
                                                         (uint)!bVar17 * auVar192._8_4_,
                                                         CONCAT44((uint)bVar77 * (int)auVar30._4_4_
                                                                  | (uint)!bVar77 * auVar192._4_4_,
                                                                  (uint)(bVar74 & 1) *
                                                                  (int)auVar30._0_4_ |
                                                                  (uint)!(bool)(bVar74 & 1) *
                                                                  auVar192._0_4_)))),auVar105);
        auVar93 = vsubps_avx(auVar117,auVar112);
        auVar94 = vsubps_avx(auVar97,auVar113);
        auVar106 = vsubps_avx(auVar105,auVar114);
        auVar96 = vsubps_avx(auVar112,auVar115);
        auVar44._4_4_ = auVar93._4_4_ * fVar148;
        auVar44._0_4_ = auVar93._0_4_ * fVar82;
        auVar44._8_4_ = auVar93._8_4_ * fVar130;
        auVar44._12_4_ = auVar93._12_4_ * fVar133;
        auVar44._16_4_ = auVar93._16_4_ * 0.0;
        auVar44._20_4_ = auVar93._20_4_ * 0.0;
        auVar44._24_4_ = auVar93._24_4_ * 0.0;
        auVar44._28_4_ = iVar2;
        auVar86 = vfmsub231ps_fma(auVar44,auVar112,auVar107);
        auVar45._4_4_ = fVar129 * auVar107._4_4_;
        auVar45._0_4_ = fVar83 * auVar107._0_4_;
        auVar45._8_4_ = fVar131 * auVar107._8_4_;
        auVar45._12_4_ = fVar134 * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * 0.0;
        auVar45._20_4_ = auVar107._20_4_ * 0.0;
        auVar45._24_4_ = auVar107._24_4_ * 0.0;
        auVar45._28_4_ = auVar95._28_4_;
        auVar85 = vfmsub231ps_fma(auVar45,auVar97,auVar92);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,ZEXT1632(auVar86));
        auVar156._0_4_ = auVar92._0_4_ * auVar112._0_4_;
        auVar156._4_4_ = auVar92._4_4_ * auVar112._4_4_;
        auVar156._8_4_ = auVar92._8_4_ * auVar112._8_4_;
        auVar156._12_4_ = auVar92._12_4_ * auVar112._12_4_;
        auVar156._16_4_ = auVar92._16_4_ * fVar149;
        auVar156._20_4_ = auVar92._20_4_ * fVar137;
        auVar156._24_4_ = auVar92._24_4_ * fVar142;
        auVar156._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar156,auVar105,auVar93);
        auVar98 = vfmadd231ps_avx512vl(auVar95,auVar99,ZEXT1632(auVar86));
        auVar95 = vmulps_avx512vl(auVar96,auVar113);
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar94,auVar115);
        auVar46._4_4_ = auVar106._4_4_ * auVar115._4_4_;
        auVar46._0_4_ = auVar106._0_4_ * auVar115._0_4_;
        auVar46._8_4_ = auVar106._8_4_ * auVar115._8_4_;
        auVar46._12_4_ = auVar106._12_4_ * auVar115._12_4_;
        auVar46._16_4_ = auVar106._16_4_ * auVar115._16_4_;
        auVar46._20_4_ = auVar106._20_4_ * auVar115._20_4_;
        auVar46._24_4_ = auVar106._24_4_ * auVar115._24_4_;
        auVar46._28_4_ = auVar115._28_4_;
        auVar86 = vfmsub231ps_fma(auVar46,auVar114,auVar96);
        auVar157._0_4_ = auVar114._0_4_ * auVar94._0_4_;
        auVar157._4_4_ = auVar114._4_4_ * auVar94._4_4_;
        auVar157._8_4_ = auVar114._8_4_ * auVar94._8_4_;
        auVar157._12_4_ = auVar114._12_4_ * auVar94._12_4_;
        auVar157._16_4_ = fVar143 * auVar94._16_4_;
        auVar157._20_4_ = fVar166 * auVar94._20_4_;
        auVar157._24_4_ = fVar168 * auVar94._24_4_;
        auVar157._28_4_ = 0;
        auVar85 = vfmsub231ps_fma(auVar157,auVar106,auVar113);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar99,auVar95);
        auVar91 = vfmadd231ps_avx512vl(auVar95,auVar99,ZEXT1632(auVar86));
        auVar95 = vmaxps_avx(auVar98,auVar91);
        uVar144 = vcmpps_avx512vl(auVar95,auVar99,2);
        bVar81 = bVar81 & (byte)uVar144;
        auVar189 = ZEXT3264(local_4e0);
        auVar190 = ZEXT3264(local_500);
        auVar191 = ZEXT3264(local_540);
        auVar187 = ZEXT3264(local_660);
        if (bVar81 == 0) {
          bVar77 = false;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar196 = ZEXT3264(auVar95);
          auVar195 = ZEXT3264(local_640);
          auVar198 = ZEXT3264(local_600);
          auVar197 = ZEXT3264(local_620);
        }
        else {
          uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar180._4_4_ = uVar138;
          auVar180._0_4_ = uVar138;
          auVar180._8_4_ = uVar138;
          auVar180._12_4_ = uVar138;
          auVar180._16_4_ = uVar138;
          auVar180._20_4_ = uVar138;
          auVar180._24_4_ = uVar138;
          auVar180._28_4_ = uVar138;
          auVar182 = ZEXT3264(auVar180);
          auVar47._4_4_ = auVar96._4_4_ * auVar92._4_4_;
          auVar47._0_4_ = auVar96._0_4_ * auVar92._0_4_;
          auVar47._8_4_ = auVar96._8_4_ * auVar92._8_4_;
          auVar47._12_4_ = auVar96._12_4_ * auVar92._12_4_;
          auVar47._16_4_ = auVar96._16_4_ * auVar92._16_4_;
          auVar47._20_4_ = auVar96._20_4_ * auVar92._20_4_;
          auVar47._24_4_ = auVar96._24_4_ * auVar92._24_4_;
          auVar47._28_4_ = auVar95._28_4_;
          auVar192 = vfmsub231ps_fma(auVar47,auVar106,auVar93);
          auVar48._4_4_ = auVar93._4_4_ * auVar94._4_4_;
          auVar48._0_4_ = auVar93._0_4_ * auVar94._0_4_;
          auVar48._8_4_ = auVar93._8_4_ * auVar94._8_4_;
          auVar48._12_4_ = auVar93._12_4_ * auVar94._12_4_;
          auVar48._16_4_ = auVar93._16_4_ * auVar94._16_4_;
          auVar48._20_4_ = auVar93._20_4_ * auVar94._20_4_;
          auVar48._24_4_ = auVar93._24_4_ * auVar94._24_4_;
          auVar48._28_4_ = auVar93._28_4_;
          auVar85 = vfmsub231ps_fma(auVar48,auVar107,auVar96);
          auVar49._4_4_ = auVar106._4_4_ * auVar107._4_4_;
          auVar49._0_4_ = auVar106._0_4_ * auVar107._0_4_;
          auVar49._8_4_ = auVar106._8_4_ * auVar107._8_4_;
          auVar49._12_4_ = auVar106._12_4_ * auVar107._12_4_;
          auVar49._16_4_ = auVar106._16_4_ * auVar107._16_4_;
          auVar49._20_4_ = auVar106._20_4_ * auVar107._20_4_;
          auVar49._24_4_ = auVar106._24_4_ * auVar107._24_4_;
          auVar49._28_4_ = auVar106._28_4_;
          auVar84 = vfmsub231ps_fma(auVar49,auVar94,auVar92);
          auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar84));
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar192),auVar99);
          auVar92 = vrcp14ps_avx512vl(auVar95);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar196 = ZEXT3264(auVar93);
          auVar94 = vfnmadd213ps_avx512vl(auVar92,auVar95,auVar93);
          auVar86 = vfmadd132ps_fma(auVar94,auVar92,auVar92);
          auVar50._4_4_ = auVar84._4_4_ * auVar112._4_4_;
          auVar50._0_4_ = auVar84._0_4_ * auVar112._0_4_;
          auVar50._8_4_ = auVar84._8_4_ * auVar112._8_4_;
          auVar50._12_4_ = auVar84._12_4_ * auVar112._12_4_;
          auVar50._16_4_ = fVar149 * 0.0;
          auVar50._20_4_ = fVar137 * 0.0;
          auVar50._24_4_ = fVar142 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar85 = vfmadd231ps_fma(auVar50,auVar105,ZEXT1632(auVar85));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar97,ZEXT1632(auVar192));
          fVar149 = auVar86._0_4_;
          fVar137 = auVar86._4_4_;
          fVar142 = auVar86._8_4_;
          fVar143 = auVar86._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar143,
                                         CONCAT48(auVar85._8_4_ * fVar142,
                                                  CONCAT44(auVar85._4_4_ * fVar137,
                                                           auVar85._0_4_ * fVar149))));
          auVar171._4_4_ = uVar172;
          auVar171._0_4_ = uVar172;
          auVar171._8_4_ = uVar172;
          auVar171._12_4_ = uVar172;
          auVar171._16_4_ = uVar172;
          auVar171._20_4_ = uVar172;
          auVar171._24_4_ = uVar172;
          auVar171._28_4_ = uVar172;
          uVar144 = vcmpps_avx512vl(local_3a0,auVar180,2);
          uVar26 = vcmpps_avx512vl(auVar171,local_3a0,2);
          bVar81 = (byte)uVar144 & (byte)uVar26 & bVar81;
          auVar198 = ZEXT3264(local_600);
          auVar197 = ZEXT3264(local_620);
          if (bVar81 == 0) {
            bVar77 = false;
            auVar195 = ZEXT3264(local_640);
          }
          else {
            uVar144 = vcmpps_avx512vl(auVar95,auVar99,4);
            bVar81 = bVar81 & (byte)uVar144;
            auVar195 = ZEXT3264(local_640);
            if (bVar81 != 0) {
              fVar166 = auVar98._0_4_ * fVar149;
              fVar168 = auVar98._4_4_ * fVar137;
              auVar51._4_4_ = fVar168;
              auVar51._0_4_ = fVar166;
              fVar82 = auVar98._8_4_ * fVar142;
              auVar51._8_4_ = fVar82;
              fVar83 = auVar98._12_4_ * fVar143;
              auVar51._12_4_ = fVar83;
              fVar148 = auVar98._16_4_ * 0.0;
              auVar51._16_4_ = fVar148;
              fVar129 = auVar98._20_4_ * 0.0;
              auVar51._20_4_ = fVar129;
              fVar130 = auVar98._24_4_ * 0.0;
              auVar51._24_4_ = fVar130;
              auVar51._28_4_ = auVar95._28_4_;
              auVar92 = vsubps_avx512vl(auVar93,auVar51);
              local_3e0._0_4_ =
                   (float)((uint)(bVar74 & 1) * (int)fVar166 |
                          (uint)!(bool)(bVar74 & 1) * auVar92._0_4_);
              bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar77 * (int)fVar168 | (uint)!bVar77 * auVar92._4_4_)
              ;
              bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar77 * (int)fVar82 | (uint)!bVar77 * auVar92._8_4_);
              bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar77 * (int)fVar83 | (uint)!bVar77 * auVar92._12_4_);
              bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar77 * (int)fVar148 | (uint)!bVar77 * auVar92._16_4_);
              bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar77 * (int)fVar129 | (uint)!bVar77 * auVar92._20_4_);
              bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar77 * (int)fVar130 | (uint)!bVar77 * auVar92._24_4_);
              bVar77 = SUB81(uVar75 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar77 * auVar95._28_4_ | (uint)!bVar77 * auVar92._28_4_);
              auVar95 = vsubps_avx(ZEXT1632(auVar11),auVar102);
              auVar86 = vfmadd213ps_fma(auVar95,local_3e0,auVar102);
              uVar138 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar31._4_4_ = uVar138;
              auVar31._0_4_ = uVar138;
              auVar31._8_4_ = uVar138;
              auVar31._12_4_ = uVar138;
              auVar31._16_4_ = uVar138;
              auVar31._20_4_ = uVar138;
              auVar31._24_4_ = uVar138;
              auVar31._28_4_ = uVar138;
              auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                           CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                    CONCAT44(auVar86._4_4_ +
                                                                             auVar86._4_4_,
                                                                             auVar86._0_4_ +
                                                                             auVar86._0_4_)))),
                                        auVar31);
              uVar144 = vcmpps_avx512vl(local_3a0,auVar95,6);
              if (((byte)uVar144 & bVar81) != 0) {
                auVar147._0_4_ = auVar91._0_4_ * fVar149;
                auVar147._4_4_ = auVar91._4_4_ * fVar137;
                auVar147._8_4_ = auVar91._8_4_ * fVar142;
                auVar147._12_4_ = auVar91._12_4_ * fVar143;
                auVar147._16_4_ = auVar91._16_4_ * 0.0;
                auVar147._20_4_ = auVar91._20_4_ * 0.0;
                auVar147._24_4_ = auVar91._24_4_ * 0.0;
                auVar147._28_4_ = 0;
                auVar95 = vsubps_avx512vl(auVar93,auVar147);
                auVar118._0_4_ =
                     (uint)(bVar74 & 1) * (int)auVar147._0_4_ |
                     (uint)!(bool)(bVar74 & 1) * auVar95._0_4_;
                bVar77 = (bool)((byte)(uVar75 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar77 * (int)auVar147._4_4_ | (uint)!bVar77 * auVar95._4_4_;
                bVar77 = (bool)((byte)(uVar75 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar77 * (int)auVar147._8_4_ | (uint)!bVar77 * auVar95._8_4_;
                bVar77 = (bool)((byte)(uVar75 >> 3) & 1);
                auVar118._12_4_ =
                     (uint)bVar77 * (int)auVar147._12_4_ | (uint)!bVar77 * auVar95._12_4_;
                bVar77 = (bool)((byte)(uVar75 >> 4) & 1);
                auVar118._16_4_ =
                     (uint)bVar77 * (int)auVar147._16_4_ | (uint)!bVar77 * auVar95._16_4_;
                bVar77 = (bool)((byte)(uVar75 >> 5) & 1);
                auVar118._20_4_ =
                     (uint)bVar77 * (int)auVar147._20_4_ | (uint)!bVar77 * auVar95._20_4_;
                bVar77 = (bool)((byte)(uVar75 >> 6) & 1);
                auVar118._24_4_ =
                     (uint)bVar77 * (int)auVar147._24_4_ | (uint)!bVar77 * auVar95._24_4_;
                auVar118._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar95._28_4_;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar118,auVar93,auVar32);
                local_380 = 0;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar77 = true, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar149 = 1.0 / auVar177._0_4_;
                    local_320[0] = fVar149 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar149 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar149 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar149 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar149 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar149 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar149 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    local_420 = 0;
                    uVar76 = (ulong)((byte)uVar144 & bVar81);
                    for (uVar75 = uVar76; (uVar75 & 1) == 0;
                        uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                      local_420 = local_420 + 1;
                    }
                    local_4a0 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_520 = auVar180;
                    local_37c = iVar13;
                    local_370 = auVar24;
                    local_360 = uVar25;
                    uStack_358 = uVar27;
                    local_350 = uVar70;
                    uStack_348 = uVar71;
                    do {
                      auVar192 = auVar194._0_16_;
                      local_480 = (uint)uVar76;
                      uStack_47c = (uint)(uVar76 >> 0x20);
                      local_220 = local_320[local_420];
                      local_200 = *(undefined4 *)(local_300 + local_420 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + local_420 * 4);
                      local_690.context = context->user;
                      fVar137 = 1.0 - local_220;
                      fVar149 = fVar137 * fVar137 * -3.0;
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137)),
                                                ZEXT416((uint)(local_220 * fVar137)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar137)),
                                                ZEXT416((uint)(local_220 * local_220)),
                                                ZEXT416(0x40000000));
                      fVar137 = auVar86._0_4_ * 3.0;
                      fVar142 = auVar85._0_4_ * 3.0;
                      fVar143 = local_220 * local_220 * 3.0;
                      auVar162._0_4_ = fVar143 * local_5a0;
                      auVar162._4_4_ = fVar143 * fStack_59c;
                      auVar162._8_4_ = fVar143 * fStack_598;
                      auVar162._12_4_ = fVar143 * fStack_594;
                      auVar84._4_4_ = fVar142;
                      auVar84._0_4_ = fVar142;
                      auVar84._8_4_ = fVar142;
                      auVar84._12_4_ = fVar142;
                      auVar86 = vfmadd132ps_fma(auVar84,auVar162,auVar193);
                      auVar151._4_4_ = fVar137;
                      auVar151._0_4_ = fVar137;
                      auVar151._8_4_ = fVar137;
                      auVar151._12_4_ = fVar137;
                      auVar86 = vfmadd132ps_fma(auVar151,auVar86,auVar8);
                      auVar139._4_4_ = fVar149;
                      auVar139._0_4_ = fVar149;
                      auVar139._8_4_ = fVar149;
                      auVar139._12_4_ = fVar149;
                      auVar86 = vfmadd213ps_fma(auVar139,auVar24,auVar86);
                      local_280 = auVar86._0_4_;
                      auVar158._8_4_ = 1;
                      auVar158._0_8_ = 0x100000001;
                      auVar158._12_4_ = 1;
                      auVar158._16_4_ = 1;
                      auVar158._20_4_ = 1;
                      auVar158._24_4_ = 1;
                      auVar158._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar158,ZEXT1632(auVar86));
                      auVar164._8_4_ = 2;
                      auVar164._0_8_ = 0x200000002;
                      auVar164._12_4_ = 2;
                      auVar164._16_4_ = 2;
                      auVar164._20_4_ = 2;
                      auVar164._24_4_ = 2;
                      auVar164._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar164,ZEXT1632(auVar86));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4c0._0_8_;
                      uStack_1d8 = local_4c0._8_8_;
                      uStack_1d0 = local_4c0._16_8_;
                      uStack_1c8 = local_4c0._24_8_;
                      local_1c0 = local_4a0;
                      vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_1a0 = (local_690.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_690.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_5c0 = local_2a0;
                      local_690.valid = (int *)local_5c0;
                      local_690.geometryUserPtr = pGVar14->userPtr;
                      local_690.hit = (RTCHitN *)&local_280;
                      local_690.N = 8;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar14->occlusionFilterN)(&local_690);
                        auVar182 = ZEXT3264(local_520);
                        auVar197 = ZEXT3264(local_620);
                        auVar198 = ZEXT3264(local_600);
                        auVar195 = ZEXT3264(local_640);
                        auVar187 = ZEXT3264(local_660);
                        auVar188 = ZEXT3264(local_560);
                        auVar191 = ZEXT3264(local_540);
                        auVar190 = ZEXT3264(local_500);
                        auVar189 = ZEXT3264(local_4e0);
                        auVar86 = vxorps_avx512vl(auVar192,auVar192);
                        auVar194 = ZEXT1664(auVar86);
                        uVar172 = local_580._0_4_;
                      }
                      auVar86 = auVar194._0_16_;
                      if (local_5c0 == (undefined1  [32])0x0) {
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar196 = ZEXT3264(auVar95);
                        uVar76 = CONCAT44(uStack_47c,local_480);
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if (p_Var15 == (RTCFilterFunctionN)0x0) {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar95);
                        }
                        else {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar95);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var15)(&local_690);
                            auVar182 = ZEXT3264(local_520);
                            auVar197 = ZEXT3264(local_620);
                            auVar198 = ZEXT3264(local_600);
                            auVar195 = ZEXT3264(local_640);
                            auVar187 = ZEXT3264(local_660);
                            auVar188 = ZEXT3264(local_560);
                            auVar191 = ZEXT3264(local_540);
                            auVar190 = ZEXT3264(local_500);
                            auVar189 = ZEXT3264(local_4e0);
                            auVar86 = vxorps_avx512vl(auVar86,auVar86);
                            auVar194 = ZEXT1664(auVar86);
                            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar196 = ZEXT3264(auVar95);
                            uVar172 = local_580._0_4_;
                          }
                        }
                        uVar75 = vptestmd_avx512vl(local_5c0,local_5c0);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar77 = (bool)((byte)uVar75 & 1);
                        bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar75 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar75 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar75 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar75 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar75 >> 6) & 1);
                        bVar22 = SUB81(uVar75 >> 7,0);
                        *(uint *)(local_690.ray + 0x100) =
                             (uint)bVar77 * auVar95._0_4_ |
                             (uint)!bVar77 * *(int *)(local_690.ray + 0x100);
                        *(uint *)(local_690.ray + 0x104) =
                             (uint)bVar16 * auVar95._4_4_ |
                             (uint)!bVar16 * *(int *)(local_690.ray + 0x104);
                        *(uint *)(local_690.ray + 0x108) =
                             (uint)bVar17 * auVar95._8_4_ |
                             (uint)!bVar17 * *(int *)(local_690.ray + 0x108);
                        *(uint *)(local_690.ray + 0x10c) =
                             (uint)bVar18 * auVar95._12_4_ |
                             (uint)!bVar18 * *(int *)(local_690.ray + 0x10c);
                        *(uint *)(local_690.ray + 0x110) =
                             (uint)bVar19 * auVar95._16_4_ |
                             (uint)!bVar19 * *(int *)(local_690.ray + 0x110);
                        *(uint *)(local_690.ray + 0x114) =
                             (uint)bVar20 * auVar95._20_4_ |
                             (uint)!bVar20 * *(int *)(local_690.ray + 0x114);
                        *(uint *)(local_690.ray + 0x118) =
                             (uint)bVar21 * auVar95._24_4_ |
                             (uint)!bVar21 * *(int *)(local_690.ray + 0x118);
                        *(uint *)(local_690.ray + 0x11c) =
                             (uint)bVar22 * auVar95._28_4_ |
                             (uint)!bVar22 * *(int *)(local_690.ray + 0x11c);
                        uVar76 = CONCAT44(uStack_47c,local_480);
                        if (local_5c0 != (undefined1  [32])0x0) {
                          bVar77 = true;
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar182._0_4_;
                      uVar75 = local_420 & 0x3f;
                      bVar77 = false;
                      local_420 = 0;
                      uVar76 = uVar76 ^ 1L << uVar75;
                      for (uVar75 = uVar76; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                        local_420 = local_420 + 1;
                      }
                    } while (uVar76 != 0);
                  }
                  goto LAB_01d60661;
                }
              }
            }
            bVar77 = false;
          }
        }
      }
LAB_01d60661:
      if (8 < iVar13) {
        local_580 = vpbroadcastd_avx512vl();
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_418 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar78 = 8;
        local_480 = uVar172;
        uStack_47c = uVar172;
        uStack_478 = uVar172;
        uStack_474 = uVar172;
        uStack_470 = uVar172;
        uStack_46c = uVar172;
        uStack_468 = uVar172;
        uStack_464 = uVar172;
        fStack_414 = fStack_418;
        fStack_410 = fStack_418;
        fStack_40c = fStack_418;
        fStack_408 = fStack_418;
        fStack_404 = fStack_418;
        local_420._0_4_ = fStack_418;
        local_420._4_4_ = fStack_418;
        do {
          auVar95 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar95,_DAT_01fe9900);
          uVar26 = vpcmpd_avx512vl(auVar106,local_580,1);
          auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar28);
          auVar92 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar78 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar78 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar78 * 4);
          local_600 = auVar198._0_32_;
          auVar96 = vmulps_avx512vl(local_600,auVar94);
          local_620 = auVar197._0_32_;
          auVar97 = vmulps_avx512vl(local_620,auVar94);
          auVar52._4_4_ = auVar94._4_4_ * (float)local_100._4_4_;
          auVar52._0_4_ = auVar94._0_4_ * (float)local_100._0_4_;
          auVar52._8_4_ = auVar94._8_4_ * fStack_f8;
          auVar52._12_4_ = auVar94._12_4_ * fStack_f4;
          auVar52._16_4_ = auVar94._16_4_ * fStack_f0;
          auVar52._20_4_ = auVar94._20_4_ * fStack_ec;
          auVar52._24_4_ = auVar94._24_4_ * fStack_e8;
          auVar52._28_4_ = auVar106._28_4_;
          auVar103 = auVar187._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar103);
          local_640 = auVar195._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar93,local_640);
          auVar97 = vfmadd231ps_avx512vl(auVar52,auVar93,local_e0);
          auVar167 = auVar191._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar92,auVar167);
          auVar104 = auVar188._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar104);
          auVar86 = vfmadd231ps_fma(auVar97,auVar92,local_c0);
          local_4e0 = auVar189._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar106,auVar95,local_4e0);
          local_500 = auVar190._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar96,auVar95,local_500);
          auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar28);
          auVar96 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar78 * 4);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar95,local_a0);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar78 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar78 * 4);
          auVar107 = vmulps_avx512vl(local_600,auVar105);
          auVar98 = vmulps_avx512vl(local_620,auVar105);
          auVar53._4_4_ = auVar105._4_4_ * (float)local_100._4_4_;
          auVar53._0_4_ = auVar105._0_4_ * (float)local_100._0_4_;
          auVar53._8_4_ = auVar105._8_4_ * fStack_f8;
          auVar53._12_4_ = auVar105._12_4_ * fStack_f4;
          auVar53._16_4_ = auVar105._16_4_ * fStack_f0;
          auVar53._20_4_ = auVar105._20_4_ * fStack_ec;
          auVar53._24_4_ = auVar105._24_4_ * fStack_e8;
          auVar53._28_4_ = uStack_e4;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,auVar103);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar97,local_640);
          auVar100 = vfmadd231ps_avx512vl(auVar53,auVar97,local_e0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,auVar167);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar104);
          auVar85 = vfmadd231ps_fma(auVar100,auVar96,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar107,auVar106,local_4e0);
          auVar89 = vfmadd231ps_avx512vl(auVar98,auVar106,local_500);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar106,local_a0);
          auVar90 = vmaxps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar85));
          auVar107 = vsubps_avx(auVar100,auVar91);
          auVar98 = vsubps_avx(auVar89,auVar99);
          auVar101 = vmulps_avx512vl(auVar99,auVar107);
          auVar102 = vmulps_avx512vl(auVar91,auVar98);
          auVar101 = vsubps_avx512vl(auVar101,auVar102);
          auVar102 = vmulps_avx512vl(auVar98,auVar98);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar107);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar102);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar144 = vcmpps_avx512vl(auVar101,auVar90,2);
          bVar81 = (byte)uVar26 & (byte)uVar144;
          if (bVar81 == 0) {
            auVar182 = ZEXT3264(auVar104);
            auVar187 = ZEXT3264(auVar103);
          }
          else {
            auVar105 = vmulps_avx512vl(local_5e0,auVar105);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar105);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar97);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_120,auVar96);
            auVar94 = vmulps_avx512vl(local_5e0,auVar94);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_160,auVar94);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar93);
            auVar96 = vfmadd213ps_avx512vl(auVar95,local_120,auVar92);
            auVar95 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar78 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar78 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar78 * 4);
            auVar94 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar78 * 4);
            auVar97 = vmulps_avx512vl(local_600,auVar94);
            auVar105 = vmulps_avx512vl(local_620,auVar94);
            auVar94 = vmulps_avx512vl(local_5e0,auVar94);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar103);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar93,local_640);
            auVar93 = vfmadd231ps_avx512vl(auVar94,local_160,auVar93);
            auVar94 = vfmadd231ps_avx512vl(auVar97,auVar92,auVar167);
            auVar97 = vfmadd231ps_avx512vl(auVar105,auVar92,auVar104);
            auVar92 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar95,local_4e0);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_500);
            auVar105 = vfmadd231ps_avx512vl(auVar92,local_120,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar78 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar78 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar78 * 4);
            auVar90 = vmulps_avx512vl(local_600,auVar93);
            auVar101 = vmulps_avx512vl(local_620,auVar93);
            auVar93 = vmulps_avx512vl(local_5e0,auVar93);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar103);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_640);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_160,auVar92);
            auVar92 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar78 * 4);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar167);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar104);
            auVar92 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
            auVar93 = vfmadd231ps_avx512vl(auVar90,auVar95,local_4e0);
            auVar90 = vfmadd231ps_avx512vl(auVar101,auVar95,local_500);
            auVar92 = vfmadd231ps_avx512vl(auVar92,local_120,auVar95);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar94,auVar101);
            vandps_avx512vl(auVar97,auVar101);
            auVar95 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar105,auVar101);
            auVar95 = vmaxps_avx(auVar95,auVar101);
            auVar73._4_4_ = fStack_3fc;
            auVar73._0_4_ = local_400;
            auVar73._8_4_ = fStack_3f8;
            auVar73._12_4_ = fStack_3f4;
            auVar73._16_4_ = fStack_3f0;
            auVar73._20_4_ = fStack_3ec;
            auVar73._24_4_ = fStack_3e8;
            auVar73._28_4_ = fStack_3e4;
            uVar75 = vcmpps_avx512vl(auVar95,auVar73,1);
            bVar16 = (bool)((byte)uVar75 & 1);
            auVar119._0_4_ = (float)((uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar94._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar94._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar94._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar94._12_4_);
            bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar94._16_4_);
            bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar94._20_4_);
            bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar94._24_4_);
            bVar16 = SUB81(uVar75 >> 7,0);
            auVar119._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar94._28_4_;
            bVar16 = (bool)((byte)uVar75 & 1);
            auVar120._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar97._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar97._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar97._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar97._12_4_);
            bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar97._16_4_);
            bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar97._20_4_);
            bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar97._24_4_);
            bVar16 = SUB81(uVar75 >> 7,0);
            auVar120._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar97._28_4_;
            vandps_avx512vl(auVar93,auVar101);
            vandps_avx512vl(auVar90,auVar101);
            auVar95 = vmaxps_avx(auVar120,auVar120);
            vandps_avx512vl(auVar92,auVar101);
            auVar95 = vmaxps_avx(auVar95,auVar120);
            uVar75 = vcmpps_avx512vl(auVar95,auVar73,1);
            bVar16 = (bool)((byte)uVar75 & 1);
            auVar121._0_4_ = (uint)bVar16 * auVar107._0_4_ | (uint)!bVar16 * auVar93._0_4_;
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar16 * auVar107._4_4_ | (uint)!bVar16 * auVar93._4_4_;
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar16 * auVar107._8_4_ | (uint)!bVar16 * auVar93._8_4_;
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar16 * auVar107._12_4_ | (uint)!bVar16 * auVar93._12_4_;
            bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar121._16_4_ = (uint)bVar16 * auVar107._16_4_ | (uint)!bVar16 * auVar93._16_4_;
            bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar121._20_4_ = (uint)bVar16 * auVar107._20_4_ | (uint)!bVar16 * auVar93._20_4_;
            bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar121._24_4_ = (uint)bVar16 * auVar107._24_4_ | (uint)!bVar16 * auVar93._24_4_;
            bVar16 = SUB81(uVar75 >> 7,0);
            auVar121._28_4_ = (uint)bVar16 * auVar107._28_4_ | (uint)!bVar16 * auVar93._28_4_;
            bVar16 = (bool)((byte)uVar75 & 1);
            auVar122._0_4_ = (float)((uint)bVar16 * auVar98._0_4_ | (uint)!bVar16 * auVar90._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar90._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar90._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar90._12_4_);
            bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
            auVar122._16_4_ =
                 (float)((uint)bVar16 * auVar98._16_4_ | (uint)!bVar16 * auVar90._16_4_);
            bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
            auVar122._20_4_ =
                 (float)((uint)bVar16 * auVar98._20_4_ | (uint)!bVar16 * auVar90._20_4_);
            bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
            auVar122._24_4_ =
                 (float)((uint)bVar16 * auVar98._24_4_ | (uint)!bVar16 * auVar90._24_4_);
            bVar16 = SUB81(uVar75 >> 7,0);
            auVar122._28_4_ = (uint)bVar16 * auVar98._28_4_ | (uint)!bVar16 * auVar90._28_4_;
            auVar175._8_4_ = 0x80000000;
            auVar175._0_8_ = 0x8000000080000000;
            auVar175._12_4_ = 0x80000000;
            auVar175._16_4_ = 0x80000000;
            auVar175._20_4_ = 0x80000000;
            auVar175._24_4_ = 0x80000000;
            auVar175._28_4_ = 0x80000000;
            auVar95 = vxorps_avx512vl(auVar121,auVar175);
            auVar90 = auVar194._0_32_;
            auVar92 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar90);
            auVar193 = vfmadd231ps_fma(auVar92,auVar120,auVar120);
            auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar193));
            auVar186._8_4_ = 0xbf000000;
            auVar186._0_8_ = 0xbf000000bf000000;
            auVar186._12_4_ = 0xbf000000;
            auVar186._16_4_ = 0xbf000000;
            auVar186._20_4_ = 0xbf000000;
            auVar186._24_4_ = 0xbf000000;
            auVar186._28_4_ = 0xbf000000;
            fVar149 = auVar92._0_4_;
            fVar137 = auVar92._4_4_;
            fVar142 = auVar92._8_4_;
            fVar143 = auVar92._12_4_;
            fVar166 = auVar92._16_4_;
            fVar168 = auVar92._20_4_;
            fVar82 = auVar92._24_4_;
            auVar54._4_4_ = fVar137 * fVar137 * fVar137 * auVar193._4_4_ * -0.5;
            auVar54._0_4_ = fVar149 * fVar149 * fVar149 * auVar193._0_4_ * -0.5;
            auVar54._8_4_ = fVar142 * fVar142 * fVar142 * auVar193._8_4_ * -0.5;
            auVar54._12_4_ = fVar143 * fVar143 * fVar143 * auVar193._12_4_ * -0.5;
            auVar54._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar54._20_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar54._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
            auVar54._28_4_ = auVar120._28_4_;
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar92 = vfmadd231ps_avx512vl(auVar54,auVar93,auVar92);
            auVar55._4_4_ = auVar120._4_4_ * auVar92._4_4_;
            auVar55._0_4_ = auVar120._0_4_ * auVar92._0_4_;
            auVar55._8_4_ = auVar120._8_4_ * auVar92._8_4_;
            auVar55._12_4_ = auVar120._12_4_ * auVar92._12_4_;
            auVar55._16_4_ = auVar120._16_4_ * auVar92._16_4_;
            auVar55._20_4_ = auVar120._20_4_ * auVar92._20_4_;
            auVar55._24_4_ = auVar120._24_4_ * auVar92._24_4_;
            auVar55._28_4_ = 0;
            auVar56._4_4_ = auVar92._4_4_ * -auVar119._4_4_;
            auVar56._0_4_ = auVar92._0_4_ * -auVar119._0_4_;
            auVar56._8_4_ = auVar92._8_4_ * -auVar119._8_4_;
            auVar56._12_4_ = auVar92._12_4_ * -auVar119._12_4_;
            auVar56._16_4_ = auVar92._16_4_ * -auVar119._16_4_;
            auVar56._20_4_ = auVar92._20_4_ * -auVar119._20_4_;
            auVar56._24_4_ = auVar92._24_4_ * -auVar119._24_4_;
            auVar56._28_4_ = auVar120._28_4_;
            auVar94 = vmulps_avx512vl(auVar92,auVar90);
            auVar92 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar90);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar122,auVar122);
            auVar97 = vrsqrt14ps_avx512vl(auVar92);
            auVar92 = vmulps_avx512vl(auVar92,auVar186);
            fVar149 = auVar97._0_4_;
            fVar137 = auVar97._4_4_;
            fVar142 = auVar97._8_4_;
            fVar143 = auVar97._12_4_;
            fVar166 = auVar97._16_4_;
            fVar168 = auVar97._20_4_;
            fVar82 = auVar97._24_4_;
            auVar57._4_4_ = fVar137 * fVar137 * fVar137 * auVar92._4_4_;
            auVar57._0_4_ = fVar149 * fVar149 * fVar149 * auVar92._0_4_;
            auVar57._8_4_ = fVar142 * fVar142 * fVar142 * auVar92._8_4_;
            auVar57._12_4_ = fVar143 * fVar143 * fVar143 * auVar92._12_4_;
            auVar57._16_4_ = fVar166 * fVar166 * fVar166 * auVar92._16_4_;
            auVar57._20_4_ = fVar168 * fVar168 * fVar168 * auVar92._20_4_;
            auVar57._24_4_ = fVar82 * fVar82 * fVar82 * auVar92._24_4_;
            auVar57._28_4_ = auVar92._28_4_;
            auVar92 = vfmadd231ps_avx512vl(auVar57,auVar93,auVar97);
            auVar58._4_4_ = auVar122._4_4_ * auVar92._4_4_;
            auVar58._0_4_ = auVar122._0_4_ * auVar92._0_4_;
            auVar58._8_4_ = auVar122._8_4_ * auVar92._8_4_;
            auVar58._12_4_ = auVar122._12_4_ * auVar92._12_4_;
            auVar58._16_4_ = auVar122._16_4_ * auVar92._16_4_;
            auVar58._20_4_ = auVar122._20_4_ * auVar92._20_4_;
            auVar58._24_4_ = auVar122._24_4_ * auVar92._24_4_;
            auVar58._28_4_ = auVar97._28_4_;
            auVar59._4_4_ = auVar92._4_4_ * auVar95._4_4_;
            auVar59._0_4_ = auVar92._0_4_ * auVar95._0_4_;
            auVar59._8_4_ = auVar92._8_4_ * auVar95._8_4_;
            auVar59._12_4_ = auVar92._12_4_ * auVar95._12_4_;
            auVar59._16_4_ = auVar92._16_4_ * auVar95._16_4_;
            auVar59._20_4_ = auVar92._20_4_ * auVar95._20_4_;
            auVar59._24_4_ = auVar92._24_4_ * auVar95._24_4_;
            auVar59._28_4_ = auVar95._28_4_;
            auVar95 = vmulps_avx512vl(auVar92,auVar90);
            auVar193 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar86),auVar91);
            auVar92 = ZEXT1632(auVar86);
            auVar8 = vfmadd213ps_fma(auVar56,auVar92,auVar99);
            auVar93 = vfmadd213ps_avx512vl(auVar94,auVar92,auVar96);
            auVar97 = vfmadd213ps_avx512vl(auVar58,ZEXT1632(auVar85),auVar100);
            auVar173 = vfnmadd213ps_fma(auVar55,auVar92,auVar91);
            auVar105 = ZEXT1632(auVar85);
            auVar192 = vfmadd213ps_fma(auVar59,auVar105,auVar89);
            auVar150 = vfnmadd213ps_fma(auVar56,auVar92,auVar99);
            auVar11 = vfmadd213ps_fma(auVar95,auVar105,auVar106);
            auVar99 = ZEXT1632(auVar86);
            auVar169 = vfnmadd231ps_fma(auVar96,auVar99,auVar94);
            auVar30 = vfnmadd213ps_fma(auVar58,auVar105,auVar100);
            auVar87 = vfnmadd213ps_fma(auVar59,auVar105,auVar89);
            auVar174 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar85),auVar95);
            auVar106 = vsubps_avx512vl(auVar97,ZEXT1632(auVar173));
            auVar95 = vsubps_avx(ZEXT1632(auVar192),ZEXT1632(auVar150));
            auVar92 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar169));
            auVar60._4_4_ = auVar95._4_4_ * auVar169._4_4_;
            auVar60._0_4_ = auVar95._0_4_ * auVar169._0_4_;
            auVar60._8_4_ = auVar95._8_4_ * auVar169._8_4_;
            auVar60._12_4_ = auVar95._12_4_ * auVar169._12_4_;
            auVar60._16_4_ = auVar95._16_4_ * 0.0;
            auVar60._20_4_ = auVar95._20_4_ * 0.0;
            auVar60._24_4_ = auVar95._24_4_ * 0.0;
            auVar60._28_4_ = auVar94._28_4_;
            auVar86 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar150),auVar92);
            auVar61._4_4_ = auVar92._4_4_ * auVar173._4_4_;
            auVar61._0_4_ = auVar92._0_4_ * auVar173._0_4_;
            auVar61._8_4_ = auVar92._8_4_ * auVar173._8_4_;
            auVar61._12_4_ = auVar92._12_4_ * auVar173._12_4_;
            auVar61._16_4_ = auVar92._16_4_ * 0.0;
            auVar61._20_4_ = auVar92._20_4_ * 0.0;
            auVar61._24_4_ = auVar92._24_4_ * 0.0;
            auVar61._28_4_ = auVar92._28_4_;
            auVar84 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar169),auVar106);
            auVar62._4_4_ = auVar150._4_4_ * auVar106._4_4_;
            auVar62._0_4_ = auVar150._0_4_ * auVar106._0_4_;
            auVar62._8_4_ = auVar150._8_4_ * auVar106._8_4_;
            auVar62._12_4_ = auVar150._12_4_ * auVar106._12_4_;
            auVar62._16_4_ = auVar106._16_4_ * 0.0;
            auVar62._20_4_ = auVar106._20_4_ * 0.0;
            auVar62._24_4_ = auVar106._24_4_ * 0.0;
            auVar62._28_4_ = auVar106._28_4_;
            auVar146 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar173),auVar95);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar146),auVar90,ZEXT1632(auVar84));
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,ZEXT1632(auVar86));
            uVar75 = vcmpps_avx512vl(auVar95,auVar90,2);
            bVar74 = (byte)uVar75;
            fVar129 = (float)((uint)(bVar74 & 1) * auVar193._0_4_ |
                             (uint)!(bool)(bVar74 & 1) * auVar30._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            fVar131 = (float)((uint)bVar16 * auVar193._4_4_ | (uint)!bVar16 * auVar30._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            fVar134 = (float)((uint)bVar16 * auVar193._8_4_ | (uint)!bVar16 * auVar30._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            fVar135 = (float)((uint)bVar16 * auVar193._12_4_ | (uint)!bVar16 * auVar30._12_4_);
            auVar105 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar134,CONCAT44(fVar131,fVar129))));
            fVar130 = (float)((uint)(bVar74 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar74 & 1) * auVar87._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            fVar133 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar87._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            fVar132 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar87._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            fVar136 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar87._12_4_);
            auVar107 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar132,CONCAT44(fVar133,fVar130))));
            auVar123._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar174._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar174._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar174._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar174._12_4_);
            fVar142 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar93._16_4_);
            auVar123._16_4_ = fVar142;
            fVar149 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar93._20_4_);
            auVar123._20_4_ = fVar149;
            fVar137 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar93._24_4_);
            auVar123._24_4_ = fVar137;
            iVar1 = (uint)(byte)(uVar75 >> 7) * auVar93._28_4_;
            auVar123._28_4_ = iVar1;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar173),auVar97);
            auVar124._0_4_ =
                 (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar86._0_4_;
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar86._4_4_;
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar86._8_4_;
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar86._12_4_;
            auVar124._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * auVar95._16_4_;
            auVar124._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * auVar95._20_4_;
            auVar124._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * auVar95._24_4_;
            auVar124._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar150),ZEXT1632(auVar192));
            auVar125._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar193._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar193._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar193._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar193._12_4_);
            fVar143 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar95._16_4_);
            auVar125._16_4_ = fVar143;
            fVar166 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar95._20_4_);
            auVar125._20_4_ = fVar166;
            fVar168 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar95._24_4_);
            auVar125._24_4_ = fVar168;
            auVar125._28_4_ = (uint)(byte)(uVar75 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar169),ZEXT1632(auVar11));
            auVar126._0_4_ =
                 (float)((uint)(bVar74 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar74 & 1) * auVar8._0_4_);
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar8._4_4_);
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar8._8_4_);
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar126._12_4_ = (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar8._12_4_)
            ;
            fVar82 = (float)((uint)((byte)(uVar75 >> 4) & 1) * auVar95._16_4_);
            auVar126._16_4_ = fVar82;
            fVar83 = (float)((uint)((byte)(uVar75 >> 5) & 1) * auVar95._20_4_);
            auVar126._20_4_ = fVar83;
            fVar148 = (float)((uint)((byte)(uVar75 >> 6) & 1) * auVar95._24_4_);
            auVar126._24_4_ = fVar148;
            iVar2 = (uint)(byte)(uVar75 >> 7) * auVar95._28_4_;
            auVar126._28_4_ = iVar2;
            auVar127._0_4_ =
                 (uint)(bVar74 & 1) * (int)auVar173._0_4_ |
                 (uint)!(bool)(bVar74 & 1) * auVar97._0_4_;
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar16 * (int)auVar173._4_4_ | (uint)!bVar16 * auVar97._4_4_;
            bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar16 * (int)auVar173._8_4_ | (uint)!bVar16 * auVar97._8_4_;
            bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar16 * (int)auVar173._12_4_ | (uint)!bVar16 * auVar97._12_4_;
            auVar127._16_4_ = (uint)!(bool)((byte)(uVar75 >> 4) & 1) * auVar97._16_4_;
            auVar127._20_4_ = (uint)!(bool)((byte)(uVar75 >> 5) & 1) * auVar97._20_4_;
            auVar127._24_4_ = (uint)!(bool)((byte)(uVar75 >> 6) & 1) * auVar97._24_4_;
            auVar127._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar97._28_4_;
            bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar75 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar75 >> 3) & 1);
            auVar97 = vsubps_avx512vl(auVar127,auVar105);
            auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar150._12_4_ |
                                                    (uint)!bVar20 * auVar192._12_4_,
                                                    CONCAT48((uint)bVar18 * (int)auVar150._8_4_ |
                                                             (uint)!bVar18 * auVar192._8_4_,
                                                             CONCAT44((uint)bVar16 *
                                                                      (int)auVar150._4_4_ |
                                                                      (uint)!bVar16 * auVar192._4_4_
                                                                      ,(uint)(bVar74 & 1) *
                                                                       (int)auVar150._0_4_ |
                                                                       (uint)!(bool)(bVar74 & 1) *
                                                                       auVar192._0_4_)))),auVar107);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar169._12_4_ |
                                                    (uint)!bVar21 * auVar11._12_4_,
                                                    CONCAT48((uint)bVar19 * (int)auVar169._8_4_ |
                                                             (uint)!bVar19 * auVar11._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar169._4_4_ |
                                                                      (uint)!bVar17 * auVar11._4_4_,
                                                                      (uint)(bVar74 & 1) *
                                                                      (int)auVar169._0_4_ |
                                                                      (uint)!(bool)(bVar74 & 1) *
                                                                      auVar11._0_4_)))),auVar123);
            auVar94 = vsubps_avx(auVar105,auVar124);
            auVar106 = vsubps_avx(auVar107,auVar125);
            auVar96 = vsubps_avx(auVar123,auVar126);
            auVar63._4_4_ = auVar93._4_4_ * fVar131;
            auVar63._0_4_ = auVar93._0_4_ * fVar129;
            auVar63._8_4_ = auVar93._8_4_ * fVar134;
            auVar63._12_4_ = auVar93._12_4_ * fVar135;
            auVar63._16_4_ = auVar93._16_4_ * 0.0;
            auVar63._20_4_ = auVar93._20_4_ * 0.0;
            auVar63._24_4_ = auVar93._24_4_ * 0.0;
            auVar63._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar63,auVar123,auVar97);
            auVar154._0_4_ = fVar130 * auVar97._0_4_;
            auVar154._4_4_ = fVar133 * auVar97._4_4_;
            auVar154._8_4_ = fVar132 * auVar97._8_4_;
            auVar154._12_4_ = fVar136 * auVar97._12_4_;
            auVar154._16_4_ = auVar97._16_4_ * 0.0;
            auVar154._20_4_ = auVar97._20_4_ * 0.0;
            auVar154._24_4_ = auVar97._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar154,auVar105,auVar92);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar90,ZEXT1632(auVar86));
            auVar159._0_4_ = auVar92._0_4_ * auVar123._0_4_;
            auVar159._4_4_ = auVar92._4_4_ * auVar123._4_4_;
            auVar159._8_4_ = auVar92._8_4_ * auVar123._8_4_;
            auVar159._12_4_ = auVar92._12_4_ * auVar123._12_4_;
            auVar159._16_4_ = auVar92._16_4_ * fVar142;
            auVar159._20_4_ = auVar92._20_4_ * fVar149;
            auVar159._24_4_ = auVar92._24_4_ * fVar137;
            auVar159._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar159,auVar107,auVar93);
            auVar98 = vfmadd231ps_avx512vl(auVar95,auVar90,ZEXT1632(auVar86));
            auVar95 = vmulps_avx512vl(auVar96,auVar124);
            auVar95 = vfmsub231ps_avx512vl(auVar95,auVar94,auVar126);
            auVar64._4_4_ = auVar106._4_4_ * auVar126._4_4_;
            auVar64._0_4_ = auVar106._0_4_ * auVar126._0_4_;
            auVar64._8_4_ = auVar106._8_4_ * auVar126._8_4_;
            auVar64._12_4_ = auVar106._12_4_ * auVar126._12_4_;
            auVar64._16_4_ = auVar106._16_4_ * fVar82;
            auVar64._20_4_ = auVar106._20_4_ * fVar83;
            auVar64._24_4_ = auVar106._24_4_ * fVar148;
            auVar64._28_4_ = iVar2;
            auVar86 = vfmsub231ps_fma(auVar64,auVar125,auVar96);
            auVar160._0_4_ = auVar125._0_4_ * auVar94._0_4_;
            auVar160._4_4_ = auVar125._4_4_ * auVar94._4_4_;
            auVar160._8_4_ = auVar125._8_4_ * auVar94._8_4_;
            auVar160._12_4_ = auVar125._12_4_ * auVar94._12_4_;
            auVar160._16_4_ = fVar143 * auVar94._16_4_;
            auVar160._20_4_ = fVar166 * auVar94._20_4_;
            auVar160._24_4_ = fVar168 * auVar94._24_4_;
            auVar160._28_4_ = 0;
            auVar193 = vfmsub231ps_fma(auVar160,auVar106,auVar124);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar90,auVar95);
            auVar91 = vfmadd231ps_avx512vl(auVar95,auVar90,ZEXT1632(auVar86));
            auVar95 = vmaxps_avx(auVar98,auVar91);
            uVar144 = vcmpps_avx512vl(auVar95,auVar90,2);
            bVar81 = bVar81 & (byte)uVar144;
            auVar182 = ZEXT3264(auVar104);
            if (bVar81 != 0) {
              uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar181._4_4_ = uVar138;
              auVar181._0_4_ = uVar138;
              auVar181._8_4_ = uVar138;
              auVar181._12_4_ = uVar138;
              auVar181._16_4_ = uVar138;
              auVar181._20_4_ = uVar138;
              auVar181._24_4_ = uVar138;
              auVar181._28_4_ = uVar138;
              auVar183 = ZEXT3264(auVar181);
              auVar65._4_4_ = auVar96._4_4_ * auVar92._4_4_;
              auVar65._0_4_ = auVar96._0_4_ * auVar92._0_4_;
              auVar65._8_4_ = auVar96._8_4_ * auVar92._8_4_;
              auVar65._12_4_ = auVar96._12_4_ * auVar92._12_4_;
              auVar65._16_4_ = auVar96._16_4_ * auVar92._16_4_;
              auVar65._20_4_ = auVar96._20_4_ * auVar92._20_4_;
              auVar65._24_4_ = auVar96._24_4_ * auVar92._24_4_;
              auVar65._28_4_ = auVar95._28_4_;
              auVar8 = vfmsub231ps_fma(auVar65,auVar106,auVar93);
              auVar66._4_4_ = auVar93._4_4_ * auVar94._4_4_;
              auVar66._0_4_ = auVar93._0_4_ * auVar94._0_4_;
              auVar66._8_4_ = auVar93._8_4_ * auVar94._8_4_;
              auVar66._12_4_ = auVar93._12_4_ * auVar94._12_4_;
              auVar66._16_4_ = auVar93._16_4_ * auVar94._16_4_;
              auVar66._20_4_ = auVar93._20_4_ * auVar94._20_4_;
              auVar66._24_4_ = auVar93._24_4_ * auVar94._24_4_;
              auVar66._28_4_ = auVar93._28_4_;
              auVar193 = vfmsub231ps_fma(auVar66,auVar97,auVar96);
              auVar67._4_4_ = auVar106._4_4_ * auVar97._4_4_;
              auVar67._0_4_ = auVar106._0_4_ * auVar97._0_4_;
              auVar67._8_4_ = auVar106._8_4_ * auVar97._8_4_;
              auVar67._12_4_ = auVar106._12_4_ * auVar97._12_4_;
              auVar67._16_4_ = auVar106._16_4_ * auVar97._16_4_;
              auVar67._20_4_ = auVar106._20_4_ * auVar97._20_4_;
              auVar67._24_4_ = auVar106._24_4_ * auVar97._24_4_;
              auVar67._28_4_ = auVar106._28_4_;
              auVar192 = vfmsub231ps_fma(auVar67,auVar94,auVar92);
              auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar193),ZEXT1632(auVar192));
              auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar8),auVar90);
              auVar92 = vrcp14ps_avx512vl(auVar95);
              auVar94 = auVar196._0_32_;
              auVar93 = vfnmadd213ps_avx512vl(auVar92,auVar95,auVar94);
              auVar86 = vfmadd132ps_fma(auVar93,auVar92,auVar92);
              auVar68._4_4_ = auVar192._4_4_ * auVar123._4_4_;
              auVar68._0_4_ = auVar192._0_4_ * auVar123._0_4_;
              auVar68._8_4_ = auVar192._8_4_ * auVar123._8_4_;
              auVar68._12_4_ = auVar192._12_4_ * auVar123._12_4_;
              auVar68._16_4_ = fVar142 * 0.0;
              auVar68._20_4_ = fVar149 * 0.0;
              auVar68._24_4_ = fVar137 * 0.0;
              auVar68._28_4_ = iVar1;
              auVar193 = vfmadd231ps_fma(auVar68,auVar107,ZEXT1632(auVar193));
              auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar105,ZEXT1632(auVar8));
              fVar149 = auVar86._0_4_;
              fVar137 = auVar86._4_4_;
              fVar142 = auVar86._8_4_;
              fVar143 = auVar86._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar193._12_4_ * fVar143,
                                             CONCAT48(auVar193._8_4_ * fVar142,
                                                      CONCAT44(auVar193._4_4_ * fVar137,
                                                               auVar193._0_4_ * fVar149))));
              uVar144 = vcmpps_avx512vl(local_3a0,auVar181,2);
              auVar72._4_4_ = uStack_47c;
              auVar72._0_4_ = local_480;
              auVar72._8_4_ = uStack_478;
              auVar72._12_4_ = uStack_474;
              auVar72._16_4_ = uStack_470;
              auVar72._20_4_ = uStack_46c;
              auVar72._24_4_ = uStack_468;
              auVar72._28_4_ = uStack_464;
              uVar26 = vcmpps_avx512vl(local_3a0,auVar72,0xd);
              bVar81 = (byte)uVar144 & (byte)uVar26 & bVar81;
              if (bVar81 != 0) {
                uVar144 = vcmpps_avx512vl(auVar95,auVar90,4);
                bVar81 = bVar81 & (byte)uVar144;
                auVar187 = ZEXT3264(local_660);
                if (bVar81 != 0) {
                  fVar166 = auVar98._0_4_ * fVar149;
                  fVar168 = auVar98._4_4_ * fVar137;
                  auVar69._4_4_ = fVar168;
                  auVar69._0_4_ = fVar166;
                  fVar82 = auVar98._8_4_ * fVar142;
                  auVar69._8_4_ = fVar82;
                  fVar83 = auVar98._12_4_ * fVar143;
                  auVar69._12_4_ = fVar83;
                  fVar148 = auVar98._16_4_ * 0.0;
                  auVar69._16_4_ = fVar148;
                  fVar129 = auVar98._20_4_ * 0.0;
                  auVar69._20_4_ = fVar129;
                  fVar130 = auVar98._24_4_ * 0.0;
                  auVar69._24_4_ = fVar130;
                  auVar69._28_4_ = auVar95._28_4_;
                  auVar92 = vsubps_avx512vl(auVar94,auVar69);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar74 & 1) * (int)fVar166 |
                              (uint)!(bool)(bVar74 & 1) * auVar92._0_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar16 * (int)fVar168 | (uint)!bVar16 * auVar92._4_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar16 * (int)fVar82 | (uint)!bVar16 * auVar92._8_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar16 * (int)fVar83 | (uint)!bVar16 * auVar92._12_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar16 * (int)fVar148 | (uint)!bVar16 * auVar92._16_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar16 * (int)fVar129 | (uint)!bVar16 * auVar92._20_4_);
                  bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar92._24_4_);
                  bVar16 = SUB81(uVar75 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar16 * auVar95._28_4_ | (uint)!bVar16 * auVar92._28_4_);
                  auVar95 = vsubps_avx(ZEXT1632(auVar85),auVar99);
                  auVar86 = vfmadd213ps_fma(auVar95,local_3e0,auVar99);
                  uVar138 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar34._4_4_ = uVar138;
                  auVar34._0_4_ = uVar138;
                  auVar34._8_4_ = uVar138;
                  auVar34._12_4_ = uVar138;
                  auVar34._16_4_ = uVar138;
                  auVar34._20_4_ = uVar138;
                  auVar34._24_4_ = uVar138;
                  auVar34._28_4_ = uVar138;
                  auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                               CONCAT48(auVar86._8_4_ +
                                                                        auVar86._8_4_,
                                                                        CONCAT44(auVar86._4_4_ +
                                                                                 auVar86._4_4_,
                                                                                 auVar86._0_4_ +
                                                                                 auVar86._0_4_)))),
                                            auVar34);
                  uVar144 = vcmpps_avx512vl(local_3a0,auVar95,6);
                  if (((byte)uVar144 & bVar81) != 0) {
                    auVar145._0_4_ = auVar91._0_4_ * fVar149;
                    auVar145._4_4_ = auVar91._4_4_ * fVar137;
                    auVar145._8_4_ = auVar91._8_4_ * fVar142;
                    auVar145._12_4_ = auVar91._12_4_ * fVar143;
                    auVar145._16_4_ = auVar91._16_4_ * 0.0;
                    auVar145._20_4_ = auVar91._20_4_ * 0.0;
                    auVar145._24_4_ = auVar91._24_4_ * 0.0;
                    auVar145._28_4_ = 0;
                    auVar95 = vsubps_avx512vl(auVar94,auVar145);
                    auVar128._0_4_ =
                         (uint)(bVar74 & 1) * (int)auVar145._0_4_ |
                         (uint)!(bool)(bVar74 & 1) * auVar95._0_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 1) & 1);
                    auVar128._4_4_ =
                         (uint)bVar16 * (int)auVar145._4_4_ | (uint)!bVar16 * auVar95._4_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 2) & 1);
                    auVar128._8_4_ =
                         (uint)bVar16 * (int)auVar145._8_4_ | (uint)!bVar16 * auVar95._8_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 3) & 1);
                    auVar128._12_4_ =
                         (uint)bVar16 * (int)auVar145._12_4_ | (uint)!bVar16 * auVar95._12_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 4) & 1);
                    auVar128._16_4_ =
                         (uint)bVar16 * (int)auVar145._16_4_ | (uint)!bVar16 * auVar95._16_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 5) & 1);
                    auVar128._20_4_ =
                         (uint)bVar16 * (int)auVar145._20_4_ | (uint)!bVar16 * auVar95._20_4_;
                    bVar16 = (bool)((byte)(uVar75 >> 6) & 1);
                    auVar128._24_4_ =
                         (uint)bVar16 * (int)auVar145._24_4_ | (uint)!bVar16 * auVar95._24_4_;
                    auVar128._28_4_ = (uint)!SUB81(uVar75 >> 7,0) * auVar95._28_4_;
                    auVar35._8_4_ = 0x40000000;
                    auVar35._0_8_ = 0x4000000040000000;
                    auVar35._12_4_ = 0x40000000;
                    auVar35._16_4_ = 0x40000000;
                    auVar35._20_4_ = 0x40000000;
                    auVar35._24_4_ = 0x40000000;
                    auVar35._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar128,auVar94,auVar35);
                    local_380 = (undefined4)lVar78;
                    pGVar14 = (context->scene->geometries).items[uVar79].ptr;
                    if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar74 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar74 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar86 = vcvtsi2ss_avx512f(auVar188._0_16_,local_380);
                      fVar149 = auVar86._0_4_;
                      local_320[0] = (fVar149 + local_3e0._0_4_ + 0.0) * (float)local_420;
                      local_320[1] = (fVar149 + local_3e0._4_4_ + 1.0) * local_420._4_4_;
                      local_320[2] = (fVar149 + local_3e0._8_4_ + 2.0) * fStack_418;
                      local_320[3] = (fVar149 + local_3e0._12_4_ + 3.0) * fStack_414;
                      fStack_310 = (fVar149 + local_3e0._16_4_ + 4.0) * fStack_410;
                      fStack_30c = (fVar149 + local_3e0._20_4_ + 5.0) * fStack_40c;
                      fStack_308 = (fVar149 + local_3e0._24_4_ + 6.0) * fStack_408;
                      fStack_304 = fVar149 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      uVar75 = CONCAT71(0,(byte)uVar144 & bVar81);
                      local_520._0_8_ = uVar75;
                      lVar29 = 0;
                      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                        lVar29 = lVar29 + 1;
                      }
                      local_4a0._0_8_ = lVar29;
                      local_2c0 = auVar181;
                      local_4c0._0_8_ = pGVar14;
                      local_37c = iVar13;
                      local_370 = auVar24;
                      local_360 = uVar25;
                      uStack_358 = uVar27;
                      local_350 = uVar70;
                      uStack_348 = uVar71;
                      do {
                        auVar193 = auVar194._0_16_;
                        local_220 = local_320[local_4a0._0_8_];
                        local_200 = *(undefined4 *)(local_300 + local_4a0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + local_4a0._0_8_ * 4);
                        local_690.context = context->user;
                        fVar137 = 1.0 - local_220;
                        fVar149 = fVar137 * fVar137 * -3.0;
                        auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar137)),
                                                  ZEXT416((uint)(local_220 * fVar137)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar137)),
                                                  ZEXT416((uint)(local_220 * local_220)),
                                                  ZEXT416(0x40000000));
                        fVar137 = auVar86._0_4_ * 3.0;
                        fVar142 = auVar85._0_4_ * 3.0;
                        fVar143 = local_220 * local_220 * 3.0;
                        auVar163._0_4_ = fVar143 * local_5a0;
                        auVar163._4_4_ = fVar143 * fStack_59c;
                        auVar163._8_4_ = fVar143 * fStack_598;
                        auVar163._12_4_ = fVar143 * fStack_594;
                        auVar140._4_4_ = fVar142;
                        auVar140._0_4_ = fVar142;
                        auVar140._8_4_ = fVar142;
                        auVar140._12_4_ = fVar142;
                        auVar86 = vfmadd132ps_fma(auVar140,auVar163,auVar9);
                        auVar152._4_4_ = fVar137;
                        auVar152._0_4_ = fVar137;
                        auVar152._8_4_ = fVar137;
                        auVar152._12_4_ = fVar137;
                        auVar86 = vfmadd132ps_fma(auVar152,auVar86,auVar10);
                        auVar141._4_4_ = fVar149;
                        auVar141._0_4_ = fVar149;
                        auVar141._8_4_ = fVar149;
                        auVar141._12_4_ = fVar149;
                        auVar86 = vfmadd213ps_fma(auVar141,auVar24,auVar86);
                        local_280 = auVar86._0_4_;
                        auVar161._8_4_ = 1;
                        auVar161._0_8_ = 0x100000001;
                        auVar161._12_4_ = 1;
                        auVar161._16_4_ = 1;
                        auVar161._20_4_ = 1;
                        auVar161._24_4_ = 1;
                        auVar161._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar161,ZEXT1632(auVar86));
                        auVar165._8_4_ = 2;
                        auVar165._0_8_ = 0x200000002;
                        auVar165._12_4_ = 2;
                        auVar165._16_4_ = 2;
                        auVar165._20_4_ = 2;
                        auVar165._24_4_ = 2;
                        auVar165._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar165,ZEXT1632(auVar86));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        fStack_21c = local_220;
                        fStack_218 = local_220;
                        fStack_214 = local_220;
                        fStack_210 = local_220;
                        fStack_20c = local_220;
                        fStack_208 = local_220;
                        fStack_204 = local_220;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_690.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_690.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_5c0 = local_2a0;
                        local_690.valid = (int *)local_5c0;
                        local_690.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
                        local_690.hit = (RTCHitN *)&local_280;
                        local_690.N = 8;
                        local_690.ray = (RTCRayN *)ray;
                        if (*(code **)(local_4c0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_4c0._0_8_ + 0x48))(&local_690);
                          auVar183 = ZEXT3264(local_2c0);
                          auVar187 = ZEXT3264(local_660);
                          auVar182 = ZEXT3264(local_560);
                          auVar191 = ZEXT3264(local_540);
                          auVar190 = ZEXT3264(local_500);
                          auVar189 = ZEXT3264(local_4e0);
                          auVar86 = vxorps_avx512vl(auVar193,auVar193);
                          auVar194 = ZEXT1664(auVar86);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar196 = ZEXT3264(auVar95);
                        }
                        auVar86 = auVar194._0_16_;
                        if (local_5c0 == (undefined1  [32])0x0) {
                          auVar195 = ZEXT3264(local_640);
                          auVar198 = ZEXT3264(local_600);
                          auVar197 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var15)(&local_690);
                            auVar183 = ZEXT3264(local_2c0);
                            auVar187 = ZEXT3264(local_660);
                            auVar182 = ZEXT3264(local_560);
                            auVar191 = ZEXT3264(local_540);
                            auVar190 = ZEXT3264(local_500);
                            auVar189 = ZEXT3264(local_4e0);
                            auVar86 = vxorps_avx512vl(auVar86,auVar86);
                            auVar194 = ZEXT1664(auVar86);
                            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar196 = ZEXT3264(auVar95);
                          }
                          uVar75 = vptestmd_avx512vl(local_5c0,local_5c0);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar16 = (bool)((byte)uVar75 & 1);
                          bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar75 >> 2) & 1);
                          bVar19 = (bool)((byte)(uVar75 >> 3) & 1);
                          bVar20 = (bool)((byte)(uVar75 >> 4) & 1);
                          bVar21 = (bool)((byte)(uVar75 >> 5) & 1);
                          bVar22 = (bool)((byte)(uVar75 >> 6) & 1);
                          bVar23 = SUB81(uVar75 >> 7,0);
                          *(uint *)(local_690.ray + 0x100) =
                               (uint)bVar16 * auVar95._0_4_ |
                               (uint)!bVar16 * *(int *)(local_690.ray + 0x100);
                          *(uint *)(local_690.ray + 0x104) =
                               (uint)bVar17 * auVar95._4_4_ |
                               (uint)!bVar17 * *(int *)(local_690.ray + 0x104);
                          *(uint *)(local_690.ray + 0x108) =
                               (uint)bVar18 * auVar95._8_4_ |
                               (uint)!bVar18 * *(int *)(local_690.ray + 0x108);
                          *(uint *)(local_690.ray + 0x10c) =
                               (uint)bVar19 * auVar95._12_4_ |
                               (uint)!bVar19 * *(int *)(local_690.ray + 0x10c);
                          *(uint *)(local_690.ray + 0x110) =
                               (uint)bVar20 * auVar95._16_4_ |
                               (uint)!bVar20 * *(int *)(local_690.ray + 0x110);
                          *(uint *)(local_690.ray + 0x114) =
                               (uint)bVar21 * auVar95._20_4_ |
                               (uint)!bVar21 * *(int *)(local_690.ray + 0x114);
                          *(uint *)(local_690.ray + 0x118) =
                               (uint)bVar22 * auVar95._24_4_ |
                               (uint)!bVar22 * *(int *)(local_690.ray + 0x118);
                          *(uint *)(local_690.ray + 0x11c) =
                               (uint)bVar23 * auVar95._28_4_ |
                               (uint)!bVar23 * *(int *)(local_690.ray + 0x11c);
                          auVar195 = ZEXT3264(local_640);
                          auVar198 = ZEXT3264(local_600);
                          auVar197 = ZEXT3264(local_620);
                          if (local_5c0 != (undefined1  [32])0x0) {
                            bVar74 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar183._0_4_;
                        uVar76 = local_520._0_8_ ^ 1L << (local_4a0._0_8_ & 0x3f);
                        bVar74 = 0;
                        local_520._0_8_ = uVar76;
                        lVar29 = 0;
                        for (uVar75 = uVar76; (uVar75 & 1) == 0;
                            uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                          lVar29 = lVar29 + 1;
                        }
                        local_4a0._0_8_ = lVar29;
                      } while (uVar76 != 0);
                    }
                    bVar77 = (bool)(bVar77 | bVar74);
                  }
                }
                goto LAB_01d611e0;
              }
            }
            auVar187 = ZEXT3264(local_660);
          }
LAB_01d611e0:
          lVar78 = lVar78 + 8;
          auVar188 = auVar182;
        } while ((int)lVar78 < iVar13);
      }
      if (bVar77) {
        return bVar77;
      }
      uVar138 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar138;
      auVar33._0_4_ = uVar138;
      auVar33._8_4_ = uVar138;
      auVar33._12_4_ = uVar138;
      auVar33._16_4_ = uVar138;
      auVar33._20_4_ = uVar138;
      auVar33._24_4_ = uVar138;
      auVar33._28_4_ = uVar138;
      uVar25 = vcmpps_avx512vl(local_80,auVar33,2);
      uVar79 = (uint)uVar80 & (uint)uVar25;
      uVar80 = (ulong)uVar79;
    } while (uVar79 != 0);
  }
  return bVar77;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }